

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

void ppu_hblank(gba_ppu_t *ppu)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  ushort uVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  bg_rotation_scaling_t *pb;
  bg_rotation_scaling_t *in_RDI;
  bool bVar8;
  uint8_t obj_blend_mode;
  gba_color_t pixel;
  _Bool force_obj_std_blend;
  _Bool should_blend_obj;
  _Bool should_blend;
  _Bool should_blend_multiple;
  _Bool overlaps_target_pixel;
  _Bool should_blend_single;
  _Bool should_draw;
  int bg;
  int i;
  _Bool winout_display_4;
  _Bool winobj_display_4;
  _Bool win1_display_4;
  _Bool win0_display_4;
  _Bool winout;
  _Bool win1;
  _Bool win0;
  _Bool should_blend_window;
  gba_color_t draw;
  int last_layer_drawn;
  gba_color_t last;
  int x_4;
  _Bool bg_bottom [6];
  _Bool bg_top [6];
  _Bool bg_enabled [4];
  uint8_t ey;
  uint8_t evb;
  uint8_t eva;
  uint16_t *warr_12;
  uint32_t new_b;
  uint32_t new_g;
  uint32_t new_r;
  gba_color_t blended;
  uint32_t new_b_1;
  uint32_t new_g_1;
  uint32_t new_r_1;
  gba_color_t blended_1;
  uint32_t new_b_2;
  uint32_t new_g_2;
  uint32_t new_r_2;
  gba_color_t blended_2;
  uint32_t new_b_3;
  uint32_t new_g_3;
  uint32_t new_r_3;
  gba_color_t blended_3;
  uint32_t new_b_4;
  uint32_t new_g_4;
  uint32_t new_r_4;
  gba_color_t blended_4;
  uint32_t new_b_5;
  uint32_t new_g_5;
  uint32_t new_r_5;
  gba_color_t blended_5;
  uint8_t obj_blend_mode_1;
  gba_color_t pixel_1;
  _Bool force_obj_std_blend_1;
  _Bool should_blend_obj_1;
  _Bool should_blend_1;
  _Bool should_blend_multiple_1;
  _Bool overlaps_target_pixel_1;
  _Bool should_blend_single_1;
  _Bool should_draw_1;
  int bg_1;
  int i_1;
  _Bool winout_display_7;
  _Bool winobj_display_7;
  _Bool win1_display_7;
  _Bool win0_display_7;
  _Bool winout_1;
  _Bool win1_1;
  _Bool win0_1;
  _Bool should_blend_window_1;
  gba_color_t draw_1;
  int last_layer_drawn_1;
  gba_color_t last_1;
  int x_7;
  _Bool bg_bottom_1 [6];
  _Bool bg_top_1 [6];
  _Bool bg_enabled_1 [4];
  uint8_t ey_1;
  uint8_t evb_1;
  uint8_t eva_1;
  uint16_t *warr_19;
  uint32_t new_b_6;
  uint32_t new_g_6;
  uint32_t new_r_6;
  gba_color_t blended_6;
  uint32_t new_b_7;
  uint32_t new_g_7;
  uint32_t new_r_7;
  gba_color_t blended_7;
  uint32_t new_b_8;
  uint32_t new_g_8;
  uint32_t new_r_8;
  gba_color_t blended_8;
  uint32_t new_b_9;
  uint32_t new_g_9;
  uint32_t new_r_9;
  gba_color_t blended_9;
  uint32_t new_b_10;
  uint32_t new_g_10;
  uint32_t new_r_10;
  gba_color_t blended_10;
  uint32_t new_b_11;
  uint32_t new_g_11;
  uint32_t new_r_11;
  gba_color_t blended_11;
  uint8_t obj_blend_mode_2;
  gba_color_t pixel_2;
  _Bool force_obj_std_blend_2;
  _Bool should_blend_obj_2;
  _Bool should_blend_2;
  _Bool should_blend_multiple_2;
  _Bool overlaps_target_pixel_2;
  _Bool should_blend_single_2;
  _Bool should_draw_2;
  int bg_2;
  int i_2;
  _Bool winout_display_8;
  _Bool winobj_display_8;
  _Bool win1_display_8;
  _Bool win0_display_8;
  _Bool winout_2;
  _Bool win1_2;
  _Bool win0_2;
  _Bool should_blend_window_2;
  gba_color_t draw_2;
  int last_layer_drawn_2;
  gba_color_t last_2;
  int x_8;
  _Bool bg_bottom_2 [6];
  _Bool bg_top_2 [6];
  _Bool bg_enabled_2 [4];
  uint8_t ey_2;
  uint8_t evb_2;
  uint8_t eva_2;
  uint16_t *warr_20;
  uint32_t new_b_12;
  uint32_t new_g_12;
  uint32_t new_r_12;
  gba_color_t blended_12;
  uint32_t new_b_13;
  uint32_t new_g_13;
  uint32_t new_r_13;
  gba_color_t blended_13;
  uint32_t new_b_14;
  uint32_t new_g_14;
  uint32_t new_r_14;
  gba_color_t blended_14;
  uint32_t new_b_15;
  uint32_t new_g_15;
  uint32_t new_r_15;
  gba_color_t blended_15;
  uint32_t new_b_16;
  uint32_t new_g_16;
  uint32_t new_r_16;
  gba_color_t blended_16;
  uint32_t new_b_17;
  uint32_t new_g_17;
  uint32_t new_r_17;
  gba_color_t blended_17;
  int se_number_4;
  int tilemap_y_4;
  int tilemap_x_4;
  int screenblock_number_4;
  int x_5;
  reg_se_t se_4;
  uint32_t screen_base_addr_4;
  uint32_t character_base_addr_4;
  uint16_t *warr_15;
  uint16_t *warr_13;
  _Bool winout_display_5;
  _Bool winobj_display_5;
  _Bool win1_display_5;
  _Bool win0_display_5;
  _Bool is_winout_4;
  _Bool is_winobj_4;
  _Bool is_win1in_4;
  _Bool is_win0in_4;
  int se_number_5;
  int tilemap_y_5;
  int tilemap_x_5;
  int screenblock_number_5;
  int x_6;
  reg_se_t se_5;
  uint32_t screen_base_addr_5;
  uint32_t character_base_addr_5;
  uint16_t *warr_18;
  uint16_t *warr_16;
  _Bool winout_display_6;
  _Bool winobj_display_6;
  _Bool win1_display_6;
  _Bool win0_display_6;
  _Bool is_winout_5;
  _Bool is_winobj_5;
  _Bool is_win1in_5;
  _Bool is_win0in_5;
  int se_number;
  int tilemap_y;
  int tilemap_x;
  int screenblock_number;
  int x;
  reg_se_t se;
  uint32_t screen_base_addr;
  uint32_t character_base_addr;
  uint16_t *warr_2;
  uint16_t *warr;
  _Bool winout_display;
  _Bool winobj_display;
  _Bool win1_display;
  _Bool win0_display;
  _Bool is_winout;
  _Bool is_winobj;
  _Bool is_win1in;
  _Bool is_win0in;
  int se_number_1;
  int tilemap_y_1;
  int tilemap_x_1;
  int screenblock_number_1;
  int x_1;
  reg_se_t se_1;
  uint32_t screen_base_addr_1;
  uint32_t character_base_addr_1;
  uint16_t *warr_5;
  uint16_t *warr_3;
  _Bool winout_display_1;
  _Bool winobj_display_1;
  _Bool win1_display_1;
  _Bool win0_display_1;
  _Bool is_winout_1;
  _Bool is_winobj_1;
  _Bool is_win1in_1;
  _Bool is_win0in_1;
  int se_number_2;
  int tilemap_y_2;
  int tilemap_x_2;
  int screenblock_number_2;
  int x_2;
  reg_se_t se_2;
  uint32_t screen_base_addr_2;
  uint32_t character_base_addr_2;
  uint16_t *warr_8;
  uint16_t *warr_6;
  _Bool winout_display_2;
  _Bool winobj_display_2;
  _Bool win1_display_2;
  _Bool win0_display_2;
  _Bool is_winout_2;
  _Bool is_winobj_2;
  _Bool is_win1in_2;
  _Bool is_win0in_2;
  int se_number_3;
  int tilemap_y_3;
  int tilemap_x_3;
  int screenblock_number_3;
  int x_3;
  reg_se_t se_3;
  uint32_t screen_base_addr_3;
  uint32_t character_base_addr_3;
  uint16_t *warr_11;
  uint16_t *warr_9;
  _Bool winout_display_3;
  _Bool winobj_display_3;
  _Bool win1_display_3;
  _Bool win0_display_3;
  _Bool is_winout_3;
  _Bool is_winobj_3;
  _Bool is_win1in_3;
  _Bool is_win0in_3;
  int tile_y_3;
  int tile_x_3;
  uint32_t palette_address_3;
  uint8_t tile_3;
  uint32_t tile_address_3;
  int in_tile_offset_3;
  int tile_size_3;
  int in_tile_offset_divisor_3;
  uint16_t *warr_10;
  int tile_y_2;
  int tile_x_2;
  uint32_t palette_address_2;
  uint8_t tile_2;
  uint32_t tile_address_2;
  int in_tile_offset_2;
  int tile_size_2;
  int in_tile_offset_divisor_2;
  uint16_t *warr_7;
  int tile_y_1;
  int tile_x_1;
  uint32_t palette_address_1;
  uint8_t tile_1;
  uint32_t tile_address_1;
  int in_tile_offset_1;
  int tile_size_1;
  int in_tile_offset_divisor_1;
  uint16_t *warr_4;
  int tile_y;
  int tile_x;
  uint32_t palette_address;
  uint8_t tile;
  uint32_t tile_address;
  int in_tile_offset;
  int tile_size;
  int in_tile_offset_divisor;
  uint16_t *warr_1;
  int tile_y_5;
  int tile_x_5;
  uint32_t palette_address_5;
  uint8_t tile_5;
  uint32_t tile_address_5;
  int in_tile_offset_5;
  int tile_size_5;
  int in_tile_offset_divisor_5;
  uint16_t *warr_17;
  int tile_y_4;
  int tile_x_4;
  uint32_t palette_address_4;
  uint8_t tile_4;
  uint32_t tile_address_4;
  int in_tile_offset_4;
  int tile_size_4;
  int in_tile_offset_divisor_4;
  uint16_t *warr_14;
  undefined8 in_stack_ffffffffffffef00;
  gba_interrupt_t interrupt;
  gba_ppu_t *in_stack_ffffffffffffef18;
  gba_ppu_t *in_stack_ffffffffffffef30;
  gba_ppu_t *in_stack_ffffffffffffef38;
  undefined4 in_stack_ffffffffffffef44;
  BGCNT_t *in_stack_ffffffffffffef48;
  undefined7 in_stack_ffffffffffffef50;
  undefined1 in_stack_ffffffffffffef57;
  undefined1 in_stack_ffffffffffffef58;
  undefined1 in_stack_ffffffffffffef59;
  undefined1 in_stack_ffffffffffffef5a;
  undefined1 in_stack_ffffffffffffef5b;
  undefined1 in_stack_ffffffffffffef5c;
  undefined1 in_stack_ffffffffffffef5d;
  undefined1 in_stack_ffffffffffffef5e;
  undefined1 in_stack_ffffffffffffef5f;
  bool local_10a0;
  bool local_109f;
  bool local_109e;
  bool local_109d;
  uint local_109c;
  uint local_1098;
  uint local_1094;
  bool local_1071;
  bool local_1070;
  bool local_106f;
  bool local_106e;
  bool local_106d;
  byte local_106c;
  bool local_106b;
  byte local_106a;
  bool local_1069;
  bool local_1068;
  bool local_1067;
  bool local_1066;
  bool local_1065;
  uint local_1064;
  uint local_1060;
  uint local_105c;
  int local_1058;
  byte local_1046;
  bool local_1045;
  bool local_1044;
  bool local_1043;
  bool local_1042;
  bool local_1041;
  int local_1040;
  byte local_102e;
  bool local_102d;
  bool local_102c;
  bool local_102b;
  bool local_102a;
  bool local_1029;
  byte local_1004;
  byte local_1002;
  bool local_1000;
  bool local_ffe;
  uint local_ffc;
  uint local_ff8;
  uint local_ff4;
  int local_ff0;
  byte local_fde;
  bool local_fdd;
  bool local_fdc;
  bool local_fdb;
  bool local_fda;
  bool local_fd9;
  int local_fd8;
  byte local_fc6;
  bool local_fc5;
  bool local_fc4;
  bool local_fc3;
  bool local_fc2;
  bool local_fc1;
  int local_fc0;
  byte local_fae;
  bool local_fad;
  bool local_fac;
  bool local_fab;
  bool local_faa;
  bool local_fa9;
  undefined4 in_stack_fffffffffffff058;
  undefined4 in_stack_fffffffffffff05c;
  bg_referencepoint_container_t *in_stack_fffffffffffff060;
  undefined2 in_stack_fffffffffffff068;
  undefined1 in_stack_fffffffffffff06a;
  undefined1 in_stack_fffffffffffff06b;
  undefined1 in_stack_fffffffffffff06c;
  undefined1 in_stack_fffffffffffff06d;
  undefined1 in_stack_fffffffffffff06e;
  undefined1 in_stack_fffffffffffff06f;
  undefined7 in_stack_fffffffffffff078;
  undefined1 uVar9;
  byte local_f45;
  uint local_f40;
  byte local_f33;
  ushort local_f32;
  int local_f30;
  ushort local_f2a;
  int local_f28;
  byte local_f23 [4];
  byte local_f1f;
  byte local_f1e;
  byte local_f1d [4];
  byte local_f19;
  byte local_f18;
  byte local_f17 [4];
  char local_f13;
  undefined1 local_f12;
  undefined1 local_f11;
  bg_rotation_scaling_t *local_f10;
  uint8_t *local_f08;
  undefined4 local_efc;
  uint8_t *local_ef8;
  uint local_ef0;
  int local_eec;
  bg_rotation_scaling_t *local_ee8;
  uint local_ee0;
  int local_edc;
  bg_rotation_scaling_t *local_ed8;
  uint local_ed0;
  uint local_ecc;
  uint local_ec8;
  uint local_ec4;
  uint local_ec0;
  int local_ebc;
  uint local_eb8;
  uint local_eb4;
  uint local_eb0;
  uint local_eac;
  uint local_ea8;
  int local_ea4;
  uint local_ea0;
  uint local_e9c;
  uint local_e98;
  undefined1 local_e94;
  undefined1 local_e93;
  ushort local_e92;
  ushort local_e90;
  ushort local_e8e;
  uint local_e8c;
  uint local_e88;
  uint local_e84;
  byte local_e80;
  char local_e7f;
  ushort local_e7e;
  gba_color_t local_e7c;
  ushort local_e7a;
  uint local_e78;
  uint local_e74;
  uint local_e70;
  byte local_e6c;
  char local_e6b;
  ushort local_e6a;
  gba_color_t local_e68;
  ushort local_e66;
  uint local_e64;
  uint local_e60;
  uint local_e5c;
  undefined1 local_e58;
  undefined1 local_e57;
  ushort local_e56;
  ushort local_e54;
  ushort local_e52;
  uint local_e50;
  uint local_e4c;
  uint local_e48;
  byte local_e44;
  char local_e43;
  ushort local_e42;
  gba_color_t local_e40;
  ushort local_e3e;
  uint local_e3c;
  uint local_e38;
  uint local_e34;
  byte local_e30;
  char local_e2f;
  ushort local_e2e;
  gba_color_t local_e2c;
  ushort local_e2a;
  uint local_e28;
  undefined4 local_e24;
  uint local_e20;
  uint local_e1c;
  undefined4 local_e18;
  uint local_e14;
  uint local_e10;
  undefined4 local_e0c;
  uint local_e08;
  uint local_e04;
  undefined4 local_e00;
  uint local_dfc;
  uint local_df8;
  undefined4 local_df4;
  uint local_df0;
  uint local_dec;
  undefined4 local_de8;
  uint local_de4;
  uint local_de0;
  undefined4 local_ddc;
  uint local_dd8;
  uint local_dd4;
  undefined4 local_dd0;
  uint local_dcc;
  uint local_dc8;
  undefined4 local_dc4;
  uint local_dc0;
  uint local_dbc;
  undefined4 local_db8;
  uint local_db4;
  uint local_db0;
  undefined4 local_dac;
  uint local_da8;
  uint local_da4;
  undefined4 local_da0;
  uint local_d9c;
  uint local_d98;
  undefined4 local_d94;
  uint local_d90;
  uint local_d8c;
  undefined4 local_d88;
  uint local_d84;
  uint local_d80;
  undefined4 local_d7c;
  uint local_d78;
  uint local_d74;
  undefined4 local_d70;
  uint local_d6c;
  uint local_d68;
  undefined4 local_d64;
  uint local_d60;
  uint local_d5c;
  undefined4 local_d58;
  uint local_d54;
  bg_rotation_scaling_t *local_d50;
  ushort local_d44;
  ushort local_d42;
  ushort local_d40;
  byte local_d3d;
  ushort local_d3c;
  ushort local_d3a;
  ushort local_d38;
  ushort local_d36;
  byte local_d33;
  bool local_d32;
  bool local_d31;
  byte local_d30;
  byte local_d2f;
  bool local_d2e;
  byte local_d2d;
  int local_d2c;
  uint local_d28;
  byte local_d22;
  char local_d21;
  byte local_d20;
  byte local_d1f;
  byte local_d1e;
  bool local_d1d;
  bool local_d1c;
  byte local_d1b;
  ushort local_d1a;
  int local_d18;
  ushort local_d12;
  int local_d10;
  byte local_d0b [4];
  byte local_d07;
  byte local_d06;
  byte local_d05 [4];
  byte local_d01;
  byte local_d00;
  byte local_cff [4];
  char local_cfb;
  undefined1 local_cfa;
  undefined1 local_cf9;
  bg_rotation_scaling_t *local_cf8;
  ushort *local_cf0;
  undefined4 local_ce4;
  ushort *local_ce0;
  uint local_cd8;
  int local_cd4;
  bg_rotation_scaling_t *local_cd0;
  uint local_cc8;
  int local_cc4;
  bg_rotation_scaling_t *local_cc0;
  uint local_cb8;
  uint local_cb4;
  uint local_cb0;
  uint local_cac;
  uint local_ca8;
  int local_ca4;
  uint local_ca0;
  uint local_c9c;
  uint local_c98;
  uint local_c94;
  uint local_c90;
  int local_c8c;
  uint local_c88;
  uint local_c84;
  uint local_c80;
  undefined1 local_c7c;
  undefined1 local_c7b;
  ushort local_c7a;
  ushort local_c78;
  ushort local_c76;
  uint local_c74;
  uint local_c70;
  uint local_c6c;
  byte local_c68;
  char local_c67;
  ushort local_c66;
  gba_color_t local_c64;
  ushort local_c62;
  uint local_c60;
  uint local_c5c;
  uint local_c58;
  byte local_c54;
  char local_c53;
  ushort local_c52;
  gba_color_t local_c50;
  ushort local_c4e;
  uint local_c4c;
  uint local_c48;
  uint local_c44;
  undefined1 local_c40;
  undefined1 local_c3f;
  ushort local_c3e;
  ushort local_c3c;
  ushort local_c3a;
  uint local_c38;
  uint local_c34;
  uint local_c30;
  byte local_c2c;
  char local_c2b;
  ushort local_c2a;
  gba_color_t local_c28;
  ushort local_c26;
  uint local_c24;
  uint local_c20;
  uint local_c1c;
  byte local_c18;
  char local_c17;
  ushort local_c16;
  gba_color_t local_c14;
  ushort local_c12;
  uint local_c10;
  undefined4 local_c0c;
  uint local_c08;
  uint local_c04;
  undefined4 local_c00;
  uint local_bfc;
  uint local_bf8;
  undefined4 local_bf4;
  uint local_bf0;
  uint local_bec;
  undefined4 local_be8;
  uint local_be4;
  uint local_be0;
  undefined4 local_bdc;
  uint local_bd8;
  uint local_bd4;
  undefined4 local_bd0;
  uint local_bcc;
  uint local_bc8;
  undefined4 local_bc4;
  uint local_bc0;
  uint local_bbc;
  undefined4 local_bb8;
  uint local_bb4;
  uint local_bb0;
  undefined4 local_bac;
  uint local_ba8;
  uint local_ba4;
  undefined4 local_ba0;
  uint local_b9c;
  uint local_b98;
  undefined4 local_b94;
  uint local_b90;
  uint local_b8c;
  undefined4 local_b88;
  uint local_b84;
  uint local_b80;
  undefined4 local_b7c;
  uint local_b78;
  uint local_b74;
  undefined4 local_b70;
  uint local_b6c;
  uint local_b68;
  undefined4 local_b64;
  uint local_b60;
  uint local_b5c;
  undefined4 local_b58;
  uint local_b54;
  uint local_b50;
  undefined4 local_b4c;
  uint local_b48;
  uint local_b44;
  undefined4 local_b40;
  uint local_b3c;
  bg_rotation_scaling_t *local_b38;
  ushort local_b2c;
  ushort local_b2a;
  ushort local_b28;
  byte local_b25;
  ushort local_b24;
  ushort local_b22;
  ushort local_b20;
  ushort local_b1e;
  byte local_b1b;
  bool local_b1a;
  bool local_b19;
  byte local_b18;
  byte local_b17;
  bool local_b16;
  byte local_b15;
  int local_b14;
  uint local_b10;
  byte local_b0a;
  char local_b09;
  byte local_b08;
  byte local_b07;
  byte local_b06;
  bool local_b05;
  bool local_b04;
  byte local_b03;
  ushort local_b02;
  int local_b00;
  ushort local_afa;
  int local_af8;
  byte local_af3 [4];
  byte local_aef;
  byte local_aee;
  byte local_aed [4];
  byte local_ae9;
  byte local_ae8;
  byte local_ae7 [4];
  char local_ae3;
  undefined1 local_ae2;
  undefined1 local_ae1;
  bg_rotation_scaling_t *local_ae0;
  ushort *local_ad8;
  undefined4 local_acc;
  ushort *local_ac8;
  uint local_ac0;
  int local_abc;
  bg_rotation_scaling_t *local_ab8;
  uint local_ab0;
  int local_aac;
  bg_rotation_scaling_t *local_aa8;
  uint local_a9c;
  uint local_a98;
  uint local_a94;
  uint local_a90;
  uint local_a8c;
  int local_a88;
  uint local_a84;
  uint local_a80;
  uint local_a7c;
  uint local_a78;
  uint local_a74;
  int local_a70;
  uint local_a6c;
  uint local_a68;
  uint local_a64;
  undefined1 local_a60;
  undefined1 local_a5f;
  ushort local_a5e;
  ushort local_a5c;
  ushort local_a5a;
  uint local_a58;
  uint local_a54;
  uint local_a50;
  byte local_a4c;
  char local_a4b;
  ushort local_a4a;
  gba_color_t local_a48;
  ushort local_a46;
  uint local_a44;
  uint local_a40;
  uint local_a3c;
  byte local_a38;
  char local_a37;
  ushort local_a36;
  gba_color_t local_a34;
  ushort local_a32;
  uint local_a30;
  uint local_a2c;
  uint local_a28;
  undefined1 local_a24;
  undefined1 local_a23;
  ushort local_a22;
  ushort local_a20;
  ushort local_a1e;
  uint local_a1c;
  uint local_a18;
  uint local_a14;
  byte local_a10;
  char local_a0f;
  ushort local_a0e;
  gba_color_t local_a0c;
  ushort local_a0a;
  uint local_a08;
  uint local_a04;
  uint local_a00;
  byte local_9fc;
  char local_9fb;
  ushort local_9fa;
  gba_color_t local_9f8;
  ushort local_9f6;
  uint local_9f4;
  undefined4 local_9f0;
  uint local_9ec;
  uint local_9e8;
  undefined4 local_9e4;
  uint local_9e0;
  uint local_9dc;
  undefined4 local_9d8;
  uint local_9d4;
  uint local_9d0;
  undefined4 local_9cc;
  uint local_9c8;
  uint local_9c4;
  undefined4 local_9c0;
  uint local_9bc;
  uint local_9b8;
  undefined4 local_9b4;
  uint local_9b0;
  uint local_9ac;
  undefined4 local_9a8;
  uint local_9a4;
  uint local_9a0;
  undefined4 local_99c;
  uint local_998;
  uint local_994;
  undefined4 local_990;
  uint local_98c;
  uint local_988;
  undefined4 local_984;
  uint local_980;
  uint local_97c;
  undefined4 local_978;
  uint local_974;
  uint local_970;
  undefined4 local_96c;
  uint local_968;
  uint local_964;
  undefined4 local_960;
  uint local_95c;
  uint local_958;
  undefined4 local_954;
  uint local_950;
  uint local_94c;
  undefined4 local_948;
  uint local_944;
  uint local_940;
  undefined4 local_93c;
  uint local_938;
  uint local_934;
  undefined4 local_930;
  uint local_92c;
  uint local_928;
  undefined4 local_924;
  uint local_920;
  int local_91c;
  uint local_918;
  int local_914;
  uint local_910;
  int local_90c;
  undefined4 local_908;
  int local_904;
  int local_900;
  byte local_8fc;
  byte local_8fb;
  byte local_8fa;
  byte local_8f9;
  uint local_8f8;
  uint local_8f4;
  bg_rotation_scaling_t *local_8f0;
  gba_color_t (*local_8e8) [240];
  bg_rotation_scaling_t *local_8e0;
  gba_color_t *local_8d8;
  undefined4 local_8cc;
  gba_color_t *local_8c8;
  uint8_t *local_8c0;
  int local_8b4;
  uint8_t *local_8b0;
  byte local_8a4;
  char local_8a3;
  byte local_8a2;
  byte local_8a1;
  byte local_8a0;
  byte local_89f;
  bool local_89e;
  bool local_89d;
  byte local_89c;
  byte local_89b;
  byte local_89a;
  byte local_899;
  uint local_898;
  int local_894;
  bg_rotation_scaling_t *local_890;
  byte local_881;
  uint local_880;
  int local_87c;
  bg_rotation_scaling_t *local_878;
  uint local_870;
  int local_86c;
  bg_rotation_scaling_t *local_868;
  uint local_85c;
  uint local_858;
  uint local_854;
  uint local_850;
  uint local_84c;
  int local_848;
  uint local_844;
  uint local_840;
  uint local_83c;
  uint local_838;
  uint local_834;
  int local_830;
  int local_82c;
  uint local_828;
  int local_824;
  uint local_820;
  int local_81c;
  undefined4 local_818;
  int local_814;
  int local_810;
  byte local_80c;
  byte local_80b;
  byte local_80a;
  byte local_809;
  uint local_808;
  uint local_804;
  bg_rotation_scaling_t *local_800;
  gba_color_t (*local_7f8) [240];
  bg_rotation_scaling_t *local_7f0;
  gba_color_t *local_7e8;
  undefined4 local_7dc;
  gba_color_t *local_7d8;
  uint8_t *local_7d0;
  int local_7c4;
  uint8_t *local_7c0;
  byte local_7b4;
  char local_7b3;
  byte local_7b2;
  byte local_7b1;
  byte local_7b0;
  byte local_7af;
  bool local_7ae;
  bool local_7ad;
  byte local_7ac;
  byte local_7ab;
  byte local_7aa;
  byte local_7a9;
  uint local_7a8;
  int local_7a4;
  bg_rotation_scaling_t *local_7a0;
  byte local_791;
  uint local_790;
  int local_78c;
  bg_rotation_scaling_t *local_788;
  uint local_780;
  int local_77c;
  bg_rotation_scaling_t *local_778;
  uint local_76c;
  uint local_768;
  uint local_764;
  uint local_760;
  uint local_75c;
  int local_758;
  uint local_754;
  uint local_750;
  uint local_74c;
  uint local_748;
  uint local_744;
  int local_740;
  int local_73c;
  uint local_738;
  int local_734;
  uint local_730;
  int local_72c;
  undefined4 local_728;
  int local_724;
  int local_720;
  byte local_71c;
  byte local_71b;
  byte local_71a;
  byte local_719;
  uint local_718;
  uint local_714;
  bg_rotation_scaling_t *local_710;
  gba_color_t (*local_708) [240];
  gba_color_t *local_6f8;
  undefined4 local_6ec;
  gba_color_t *local_6e8;
  uint8_t *local_6e0;
  int local_6d4;
  uint8_t *local_6d0;
  byte local_6c4;
  char local_6c3;
  byte local_6c2;
  byte local_6c1;
  byte local_6c0;
  byte local_6bf;
  byte local_6be;
  undefined1 local_6bd;
  byte local_6bc;
  byte local_6bb;
  byte local_6ba;
  byte local_6b9;
  uint local_6b8;
  int local_6b4;
  byte local_6a1;
  uint local_6a0;
  int local_69c;
  uint local_690;
  int local_68c;
  uint local_67c;
  uint local_678;
  uint local_674;
  uint local_670;
  uint local_66c;
  int local_668;
  uint local_664;
  uint local_660;
  uint local_65c;
  uint local_658;
  uint local_654;
  int local_650;
  int local_64c;
  uint local_648;
  int local_644;
  uint local_640;
  int local_63c;
  undefined4 local_638;
  int local_634;
  int local_630;
  byte local_62c;
  byte local_62b;
  byte local_62a;
  byte local_629;
  uint local_628;
  uint local_624;
  bg_rotation_scaling_t *local_620;
  gba_color_t (*local_618) [240];
  gba_color_t *local_608;
  undefined4 local_5fc;
  gba_color_t *local_5f8;
  uint8_t *local_5f0;
  int local_5e4;
  uint8_t *local_5e0;
  byte local_5d4;
  char local_5d3;
  byte local_5d2;
  byte local_5d1;
  byte local_5d0;
  byte local_5cf;
  bool local_5ce;
  bool local_5cd;
  byte local_5cc;
  byte local_5cb;
  byte local_5ca;
  byte local_5c9;
  uint local_5c8;
  int local_5c4;
  byte local_5b1;
  uint local_5b0;
  int local_5ac;
  uint local_5a0;
  int local_59c;
  uint local_58c;
  uint local_588;
  uint local_584;
  uint local_580;
  uint local_57c;
  int local_578;
  uint local_574;
  uint local_570;
  uint local_56c;
  uint local_568;
  uint local_564;
  int local_560;
  int local_55c;
  uint local_558;
  int local_554;
  uint local_550;
  int local_54c;
  undefined4 local_548;
  int local_544;
  int local_540;
  byte local_53c;
  byte local_53b;
  byte local_53a;
  byte local_539;
  uint local_538;
  uint local_534;
  bg_rotation_scaling_t *local_530;
  gba_color_t (*local_528) [240];
  gba_color_t *local_518;
  undefined4 local_50c;
  gba_color_t *local_508;
  uint8_t *local_500;
  int local_4f4;
  uint8_t *local_4f0;
  byte local_4e4;
  char local_4e3;
  byte local_4e2;
  byte local_4e1;
  byte local_4e0;
  byte local_4df;
  bool local_4de;
  bool local_4dd;
  byte local_4dc;
  byte local_4db;
  byte local_4da;
  byte local_4d9;
  uint local_4d8;
  int local_4d4;
  byte local_4c1;
  uint local_4c0;
  int local_4bc;
  uint local_4b0;
  int local_4ac;
  uint local_49c;
  uint local_498;
  uint local_494;
  uint local_490;
  uint local_48c;
  int local_488;
  uint local_484;
  uint local_480;
  uint local_47c;
  uint local_478;
  uint local_474;
  int local_470;
  int local_46c;
  uint local_468;
  int local_464;
  uint local_460;
  int local_45c;
  undefined4 local_458;
  int local_454;
  int local_450;
  byte local_44c;
  byte local_44b;
  byte local_44a;
  byte local_449;
  uint local_448;
  uint local_444;
  bg_rotation_scaling_t *local_440;
  gba_color_t (*local_438) [240];
  gba_color_t *local_428;
  undefined4 local_41c;
  gba_color_t *local_418;
  uint8_t *local_410;
  int local_404;
  uint8_t *local_400;
  byte local_3f4;
  char local_3f3;
  byte local_3f2;
  byte local_3f1;
  byte local_3f0;
  byte local_3ef;
  bool local_3ee;
  bool local_3ed;
  byte local_3ec;
  byte local_3eb;
  byte local_3ea;
  byte local_3e9;
  uint local_3e8;
  int local_3e4;
  byte local_3d1;
  uint local_3d0;
  int local_3cc;
  uint local_3c0;
  int local_3bc;
  uint local_3ac;
  uint local_3a8;
  uint local_3a4;
  uint local_3a0;
  uint local_39c;
  int local_398;
  uint local_394;
  uint local_390;
  uint local_38c;
  uint local_388;
  uint local_384;
  int local_380;
  uint local_37c;
  int local_378;
  uint local_374;
  int local_370;
  int local_36c;
  undefined1 local_365;
  int local_364;
  gba_color_t (*local_360) [240];
  undefined4 local_350;
  int local_34c;
  byte local_345;
  uint local_344;
  int local_340;
  int local_33c;
  int local_338;
  uint local_334;
  int local_330;
  int local_32c;
  undefined1 local_325;
  int local_324;
  gba_color_t (*local_320) [240];
  uint local_318;
  uint local_314;
  uint8_t *local_308;
  int local_2fc;
  uint8_t *local_2f8;
  uint local_2ec;
  int local_2e8;
  uint local_2e4;
  int local_2e0;
  int local_2dc;
  undefined1 local_2d5;
  int local_2d4;
  gba_color_t (*local_2d0) [240];
  undefined4 local_2c0;
  int local_2bc;
  byte local_2b5;
  uint local_2b4;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  uint local_2a4;
  int local_2a0;
  int local_29c;
  undefined1 local_295;
  int local_294;
  gba_color_t (*local_290) [240];
  uint local_288;
  uint local_284;
  uint8_t *local_278;
  int local_26c;
  uint8_t *local_268;
  uint local_25c;
  int local_258;
  uint local_254;
  int local_250;
  int local_24c;
  undefined1 local_245;
  int local_244;
  gba_color_t (*local_240) [240];
  undefined4 local_230;
  int local_22c;
  byte local_225;
  uint local_224;
  int local_220;
  int local_21c;
  int local_218;
  uint local_214;
  int local_210;
  int local_20c;
  undefined1 local_205;
  int local_204;
  gba_color_t (*local_200) [240];
  uint local_1f8;
  uint local_1f4;
  uint8_t *local_1e8;
  int local_1dc;
  uint8_t *local_1d8;
  uint local_1cc;
  int local_1c8;
  uint local_1c4;
  int local_1c0;
  int local_1bc;
  undefined1 local_1b5;
  int local_1b4;
  gba_color_t (*local_1b0) [240];
  undefined4 local_1a0;
  int local_19c;
  byte local_195;
  uint local_194;
  int local_190;
  int local_18c;
  int local_188;
  uint local_184;
  int local_180;
  int local_17c;
  undefined1 local_175;
  int local_174;
  gba_color_t (*local_170) [240];
  uint local_168;
  uint local_164;
  uint8_t *local_158;
  int local_14c;
  uint8_t *local_148;
  uint local_13c;
  int local_138;
  uint local_134;
  int local_130;
  int local_12c;
  undefined1 local_125;
  int local_124;
  gba_color_t (*local_120) [240];
  bg_rotation_scaling_t *local_118;
  undefined4 local_110;
  int local_10c;
  byte local_105;
  uint local_104;
  int local_100;
  int local_fc;
  int local_f8;
  uint local_f4;
  int local_f0;
  int local_ec;
  undefined1 local_e5;
  int local_e4;
  gba_color_t (*local_e0) [240];
  uint local_d8;
  uint local_d4;
  bg_rotation_scaling_t *local_d0;
  uint8_t *local_c8;
  int local_bc;
  uint8_t *local_b8;
  uint local_ac;
  int local_a8;
  uint local_a4;
  int local_a0;
  int local_9c;
  undefined1 local_95;
  int local_94;
  gba_color_t (*local_90) [240];
  bg_rotation_scaling_t *local_88;
  undefined4 local_80;
  int local_7c;
  byte local_75;
  uint local_74;
  int local_70;
  int local_6c;
  int local_68;
  uint local_64;
  int local_60;
  int local_5c;
  undefined1 local_55;
  int local_54;
  gba_color_t (*local_50) [240];
  uint local_48;
  uint local_44;
  bg_rotation_scaling_t *local_40;
  uint8_t *local_38;
  int local_2c;
  uint8_t *local_28;
  
  interrupt = (gba_interrupt_t)((ulong)in_stack_ffffffffffffef00 >> 0x20);
  uVar9 = false;
  if (0xa0 < in_RDI->raw) {
    uVar9 = in_RDI->raw != 0xe3;
  }
  if ((bool)uVar9 == false) {
    dma_start_trigger(Immediately);
  }
  if ((in_RDI[0xfb33].raw >> 4 & 1) != 0) {
    request_interrupt(interrupt);
  }
  in_RDI[0xfb33].raw = in_RDI[0xfb33].raw & 0xfffd | 2;
  if ((in_RDI->raw < 0xa0) && ((in_RDI[0xfb0d].raw >> 7 & 1) == 0)) {
    pb = (bg_rotation_scaling_t *)(ulong)(in_RDI[0xfb0d].raw & 7);
    switch(pb) {
    case (bg_rotation_scaling_t *)0x0:
      if ((in_RDI[0xfb0d].raw >> 0xc & 1) != 0) {
        render_obj(in_stack_ffffffffffffef18);
      }
      if ((in_RDI[0xfb0d].raw >> 8 & 1) != 0) {
        local_708 = (gba_color_t (*) [240])((long)in_RDI + 0x25802);
        local_710 = in_RDI + 0xfb0e;
        local_719 = (byte)in_RDI[0xfb26].raw & 1;
        local_71a = (byte)(in_RDI[0xfb26].raw >> 8) & 1;
        local_71b = (byte)((WINOUT_t *)((long)in_RDI + 0x3ec9a))->raw & 1;
        local_71c = (byte)(((WINOUT_t *)((long)in_RDI + 0x3ec9a))->raw >> 8) & 1;
        local_714 = (uint)(in_RDI[0xfb12].raw & 0x1ff);
        local_718 = (uint)(in_RDI[0xfb13].raw & 0x1ff);
        local_720 = (uint)(local_710->raw >> 2 & 3) * 0x4000;
        local_724 = (uint)(local_710->raw >> 8 & 0x1f) * 0x800;
        for (local_72c = 0; local_72c < 0xf0; local_72c = local_72c + 1) {
          local_6b4 = local_72c;
          local_6b8 = (uint)in_RDI->raw;
          local_69c = local_72c;
          local_650 = local_72c;
          local_658 = (uint)(in_RDI[0xfb22].raw >> 8);
          local_65c = (uint)(in_RDI[0xfb22].raw & 0xff);
          local_660 = (uint)(in_RDI[0xfb24].raw >> 8);
          local_664 = (uint)(in_RDI[0xfb24].raw & 0xff);
          local_6bd = false;
          if (((int)local_658 <= local_72c) && (local_6bd = false, local_72c <= (int)local_65c)) {
            local_6bd = local_660 <= local_6b8 && local_6b8 <= local_664;
          }
          local_68c = local_72c;
          local_668 = local_72c;
          local_670 = (uint)(in_RDI[0xfb23].raw >> 8);
          local_674 = (uint)(in_RDI[0xfb23].raw & 0xff);
          local_678 = (uint)(in_RDI[0xfb25].raw >> 8);
          local_67c = (uint)(in_RDI[0xfb25].raw & 0xff);
          local_6be = false;
          if (((int)local_670 <= local_72c) && (local_6be = false, local_72c <= (int)local_674)) {
            local_6be = local_678 <= local_6b8 && local_6b8 <= local_67c;
          }
          local_6bf = *(byte *)((long)in_RDI + (long)local_72c + 0x26342) & 1;
          bVar8 = true;
          if ((bool)local_6bd == false) {
            bVar8 = (bool)local_6be;
          }
          local_6c0 = (bVar8 ^ 0xffU) & 1;
          local_6c1 = (byte)(in_RDI[0xfb0d].raw >> 0xd) & 1;
          local_6c2 = (byte)(in_RDI[0xfb0d].raw >> 0xe) & 1;
          local_6c3 = -(char)(in_RDI[0xfb0d].sraw >> 0xf);
          local_6c4 = 1;
          bVar5 = local_6c2;
          if ((((local_6c1 == 0) ||
               (local_6a1 = local_719, bVar5 = local_6c4, (bool)local_6bd == false)) &&
              ((local_6c4 = bVar5, local_6c2 == 0 ||
               (local_6a1 = local_71a, (bool)local_6be == false)))) &&
             (((local_6c3 == '\0' || (local_6a1 = local_71c, local_6bf == 0)) &&
              ((bVar5 == 0 || (local_6a1 = local_71b, local_6c0 == 0)))))) {
            local_6a1 = 1;
          }
          local_6bc = local_71c;
          local_6bb = local_71b;
          local_6ba = local_71a;
          local_6b9 = local_719;
          local_6a0 = local_6b8;
          local_690 = local_6b8;
          local_66c = local_6b8;
          local_654 = local_6b8;
          if (local_6a1 == 0) {
            local_6f8 = (gba_color_t *)((long)in_RDI + 0x26432);
            local_6ec = 0;
            (*local_708)[local_72c] = *local_6f8;
            (*local_708)[local_72c].raw = (*local_708)[local_72c].raw & 0x7fff | 0x8000;
            local_6e8 = local_6f8;
          }
          else {
            switch(local_710->raw >> 0xe) {
            case 0:
              local_730 = 0;
              break;
            case 1:
              local_730 = (uint)(0xff < (int)(local_72c + local_714) % 0x200);
              break;
            case 2:
              local_730 = (uint)(0xff < (in_RDI->raw + local_718) % 0x200);
              break;
            case 3:
              iVar7 = 0;
              if (0xff < (in_RDI->raw + local_718) % 0x200) {
                iVar7 = 2;
              }
              local_730 = iVar7 + (uint)(0xff < (int)(local_72c + local_714) % 0x200);
              break;
            default:
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c"
                      ,0x161);
              fprintf(_stderr,"Unimplemented screen size: %d\n\x1b[0;m",
                      (ulong)(local_710->raw >> 0xe));
              exit(1);
            }
            local_734 = (int)(local_72c + local_714) % 0x100;
            local_738 = (in_RDI->raw + local_718) % 0x100;
            local_73c = local_734 / 8 + (local_738 / 8) * 0x20;
            local_6e0 = (uint8_t *)((long)in_RDI + 0x26832);
            local_6d4 = local_724 + local_730 * 0x800 + local_73c * 2;
            uVar1 = *(ushort *)(local_6e0 + local_6d4);
            local_728 = CONCAT22(local_728._2_2_,uVar1);
            local_1b5 = (local_710->raw >> 7 & 1) != 0;
            local_1a0 = local_728;
            local_1b4 = local_72c;
            local_1c8 = local_734 % 8;
            if ((uVar1 >> 10 & 1) != 0) {
              local_1c8 = 7 - local_1c8;
            }
            local_1cc = local_738 % 8;
            if ((uVar1 >> 0xb & 1) != 0) {
              local_1cc = 7 - local_1cc;
            }
            local_164 = (uint)(uVar1 & 0x3ff);
            local_168 = (uint)(uVar1 >> 0xc);
            local_174 = local_72c;
            local_180 = local_1c8;
            local_184 = local_1cc;
            local_188 = 2;
            if ((bool)local_1b5) {
              local_188 = 1;
            }
            local_18c = 0x20;
            if ((bool)local_1b5) {
              local_18c = 0x40;
            }
            local_190 = local_1c8 + local_1cc * 8;
            local_194 = local_190 / local_188 + local_720 + local_164 * local_18c;
            local_195 = *(byte *)((long)in_RDI + (ulong)local_194 + 0x26832);
            if ((bool)local_1b5) {
              local_19c = (uint)local_195 << 1;
            }
            else {
              local_195 = (byte)((int)(uint)local_195 >> ((byte)(local_190 % 2 << 2) & 0x1f)) & 0xf;
              local_19c = local_168 * 0x20 + (uint)local_195 * 2;
            }
            local_158 = (uint8_t *)((long)in_RDI + 0x26432);
            (*local_708)[local_72c] = *(gba_color_t *)(local_158 + local_19c);
            (*local_708)[local_72c].raw =
                 (*local_708)[local_72c].raw & 0x7fff | (ushort)(local_195 == 0) << 0xf;
            local_6d0 = local_6e0;
            local_1c4 = local_738;
            local_1c0 = local_734;
            local_1bc = local_720;
            local_1b0 = local_708;
            local_17c = local_720;
            local_175 = local_1b5;
            local_170 = local_708;
            local_14c = local_19c;
            local_148 = local_158;
          }
        }
      }
      if ((in_RDI[0xfb0d].raw >> 9 & 1) != 0) {
        local_618 = (gba_color_t (*) [240])((long)in_RDI + 0x259e2);
        local_620 = in_RDI + 0xfb0f;
        local_629 = (byte)(in_RDI[0xfb26].raw >> 1) & 1;
        local_62a = (byte)(in_RDI[0xfb26].raw >> 9) & 1;
        local_62b = (byte)(((WINOUT_t *)((long)in_RDI + 0x3ec9a))->raw >> 1) & 1;
        local_62c = (byte)(((WINOUT_t *)((long)in_RDI + 0x3ec9a))->raw >> 9) & 1;
        local_624 = (uint)(in_RDI[0xfb14].raw & 0x1ff);
        local_628 = (uint)(in_RDI[0xfb15].raw & 0x1ff);
        local_630 = (uint)(local_620->raw >> 2 & 3) * 0x4000;
        local_634 = (uint)(local_620->raw >> 8 & 0x1f) * 0x800;
        for (local_63c = 0; local_63c < 0xf0; local_63c = local_63c + 1) {
          local_5c4 = local_63c;
          local_5c8 = (uint)in_RDI->raw;
          local_5ac = local_63c;
          local_560 = local_63c;
          local_568 = (uint)(in_RDI[0xfb22].raw >> 8);
          local_56c = (uint)(in_RDI[0xfb22].raw & 0xff);
          local_570 = (uint)(in_RDI[0xfb24].raw >> 8);
          local_574 = (uint)(in_RDI[0xfb24].raw & 0xff);
          local_fa9 = false;
          if (((int)local_568 <= local_63c) && (local_fa9 = false, local_63c <= (int)local_56c)) {
            local_faa = local_570 <= local_5c8 && local_5c8 <= local_574;
            local_fa9 = local_faa;
          }
          local_5cd = local_fa9;
          local_59c = local_63c;
          local_578 = local_63c;
          local_580 = (uint)(in_RDI[0xfb23].raw >> 8);
          local_584 = (uint)(in_RDI[0xfb23].raw & 0xff);
          local_588 = (uint)(in_RDI[0xfb25].raw >> 8);
          local_58c = (uint)(in_RDI[0xfb25].raw & 0xff);
          local_fab = false;
          if (((int)local_580 <= local_63c) && (local_fab = false, local_63c <= (int)local_584)) {
            local_fac = local_588 <= local_5c8 && local_5c8 <= local_58c;
            local_fab = local_fac;
          }
          local_5ce = local_fab;
          local_5cf = *(byte *)((long)in_RDI + (long)local_63c + 0x26342) & 1;
          local_fad = true;
          if (local_fa9 == false) {
            local_fad = local_fab;
          }
          local_5d0 = (local_fad ^ 0xffU) & 1;
          local_5d1 = (byte)(in_RDI[0xfb0d].raw >> 0xd) & 1;
          local_5d2 = (byte)(in_RDI[0xfb0d].raw >> 0xe) & 1;
          local_5d3 = -(char)(in_RDI[0xfb0d].sraw >> 0xf);
          local_fae = 1;
          if (local_5d1 == 0) {
            local_fae = local_5d2;
          }
          local_5d4 = local_fae;
          if (((((local_5d1 == 0) || (local_5b1 = local_629, local_fa9 == false)) &&
               ((local_5d2 == 0 || (local_5b1 = local_62a, local_fab == false)))) &&
              ((local_5d3 == '\0' || (local_5b1 = local_62c, local_5cf == 0)))) &&
             ((local_fae == 0 || (local_5b1 = local_62b, local_5d0 == 0)))) {
            local_5b1 = 1;
          }
          local_5cc = local_62c;
          local_5cb = local_62b;
          local_5ca = local_62a;
          local_5c9 = local_629;
          local_5b0 = local_5c8;
          local_5a0 = local_5c8;
          local_57c = local_5c8;
          local_564 = local_5c8;
          if (local_5b1 == 0) {
            local_608 = (gba_color_t *)((long)in_RDI + 0x26432);
            local_5fc = 0;
            (*local_618)[local_63c] = *local_608;
            (*local_618)[local_63c].raw = (*local_618)[local_63c].raw & 0x7fff | 0x8000;
            local_5f8 = local_608;
          }
          else {
            switch(local_620->raw >> 0xe) {
            case 0:
              local_640 = 0;
              break;
            case 1:
              local_640 = (uint)(0xff < (int)(local_63c + local_624) % 0x200);
              break;
            case 2:
              local_640 = (uint)(0xff < (in_RDI->raw + local_628) % 0x200);
              break;
            case 3:
              iVar7 = 0;
              if (0xff < (in_RDI->raw + local_628) % 0x200) {
                iVar7 = 2;
              }
              local_640 = iVar7 + (uint)(0xff < (int)(local_63c + local_624) % 0x200);
              break;
            default:
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c"
                      ,0x161);
              fprintf(_stderr,"Unimplemented screen size: %d\n\x1b[0;m",
                      (ulong)(local_620->raw >> 0xe));
              exit(1);
            }
            local_644 = (int)(local_63c + local_624) % 0x100;
            local_648 = (in_RDI->raw + local_628) % 0x100;
            local_64c = local_644 / 8 + (local_648 / 8) * 0x20;
            local_5f0 = (uint8_t *)((long)in_RDI + 0x26832);
            local_5e4 = local_634 + local_640 * 0x800 + local_64c * 2;
            uVar1 = *(ushort *)(local_5f0 + local_5e4);
            local_638 = CONCAT22(local_638._2_2_,uVar1);
            local_245 = (local_620->raw >> 7 & 1) != 0;
            local_230 = local_638;
            local_244 = local_63c;
            local_258 = local_644 % 8;
            if ((uVar1 >> 10 & 1) != 0) {
              local_258 = 7 - local_258;
            }
            local_25c = local_648 % 8;
            if ((uVar1 >> 0xb & 1) != 0) {
              local_25c = 7 - local_25c;
            }
            local_1f4 = (uint)(uVar1 & 0x3ff);
            local_1f8 = (uint)(uVar1 >> 0xc);
            local_204 = local_63c;
            local_210 = local_258;
            local_214 = local_25c;
            local_218 = 2;
            if ((bool)local_245) {
              local_218 = 1;
            }
            local_21c = 0x20;
            if ((bool)local_245) {
              local_21c = 0x40;
            }
            local_220 = local_258 + local_25c * 8;
            local_224 = local_220 / local_218 + local_630 + local_1f4 * local_21c;
            local_225 = *(byte *)((long)in_RDI + (ulong)local_224 + 0x26832);
            if ((bool)local_245) {
              local_fc0 = (uint)local_225 << 1;
            }
            else {
              local_225 = (byte)((int)(uint)local_225 >> ((byte)(local_220 % 2 << 2) & 0x1f)) & 0xf;
              local_fc0 = local_1f8 * 0x20 + (uint)local_225 * 2;
            }
            local_22c = local_fc0;
            local_1e8 = (uint8_t *)((long)in_RDI + 0x26432);
            local_1dc = local_fc0;
            (*local_618)[local_63c] = *(gba_color_t *)(local_1e8 + local_fc0);
            (*local_618)[local_63c].raw =
                 (*local_618)[local_63c].raw & 0x7fff | (ushort)(local_225 == 0) << 0xf;
            local_5e0 = local_5f0;
            local_254 = local_648;
            local_250 = local_644;
            local_24c = local_630;
            local_240 = local_618;
            local_20c = local_630;
            local_205 = local_245;
            local_200 = local_618;
            local_1d8 = local_1e8;
          }
        }
      }
      if ((in_RDI[0xfb0d].raw >> 10 & 1) != 0) {
        local_528 = (gba_color_t (*) [240])((long)in_RDI + 0x25bc2);
        local_530 = in_RDI + 0xfb10;
        local_539 = (byte)(in_RDI[0xfb26].raw >> 2) & 1;
        local_53a = (byte)(in_RDI[0xfb26].raw >> 10) & 1;
        local_53b = (byte)(((WINOUT_t *)((long)in_RDI + 0x3ec9a))->raw >> 2) & 1;
        local_53c = (byte)(((WINOUT_t *)((long)in_RDI + 0x3ec9a))->raw >> 10) & 1;
        local_534 = (uint)(in_RDI[0xfb16].raw & 0x1ff);
        local_538 = (uint)(in_RDI[0xfb17].raw & 0x1ff);
        local_540 = (uint)(local_530->raw >> 2 & 3) * 0x4000;
        local_544 = (uint)(local_530->raw >> 8 & 0x1f) * 0x800;
        for (local_54c = 0; local_54c < 0xf0; local_54c = local_54c + 1) {
          local_4d4 = local_54c;
          local_4d8 = (uint)in_RDI->raw;
          local_4bc = local_54c;
          local_470 = local_54c;
          local_478 = (uint)(in_RDI[0xfb22].raw >> 8);
          local_47c = (uint)(in_RDI[0xfb22].raw & 0xff);
          local_480 = (uint)(in_RDI[0xfb24].raw >> 8);
          local_484 = (uint)(in_RDI[0xfb24].raw & 0xff);
          local_fc1 = false;
          if (((int)local_478 <= local_54c) && (local_fc1 = false, local_54c <= (int)local_47c)) {
            local_fc2 = local_480 <= local_4d8 && local_4d8 <= local_484;
            local_fc1 = local_fc2;
          }
          local_4dd = local_fc1;
          local_4ac = local_54c;
          local_488 = local_54c;
          local_490 = (uint)(in_RDI[0xfb23].raw >> 8);
          local_494 = (uint)(in_RDI[0xfb23].raw & 0xff);
          local_498 = (uint)(in_RDI[0xfb25].raw >> 8);
          local_49c = (uint)(in_RDI[0xfb25].raw & 0xff);
          local_fc3 = false;
          if (((int)local_490 <= local_54c) && (local_fc3 = false, local_54c <= (int)local_494)) {
            local_fc4 = local_498 <= local_4d8 && local_4d8 <= local_49c;
            local_fc3 = local_fc4;
          }
          local_4de = local_fc3;
          local_4df = *(byte *)((long)in_RDI + (long)local_54c + 0x26342) & 1;
          local_fc5 = true;
          if (local_fc1 == false) {
            local_fc5 = local_fc3;
          }
          local_4e0 = (local_fc5 ^ 0xffU) & 1;
          local_4e1 = (byte)(in_RDI[0xfb0d].raw >> 0xd) & 1;
          local_4e2 = (byte)(in_RDI[0xfb0d].raw >> 0xe) & 1;
          local_4e3 = -(char)(in_RDI[0xfb0d].sraw >> 0xf);
          local_fc6 = 1;
          if (local_4e1 == 0) {
            local_fc6 = local_4e2;
          }
          local_4e4 = local_fc6;
          if ((((local_4e1 == 0) || (local_4c1 = local_539, local_fc1 == false)) &&
              ((local_4e2 == 0 || (local_4c1 = local_53a, local_fc3 == false)))) &&
             (((local_4e3 == '\0' || (local_4c1 = local_53c, local_4df == 0)) &&
              ((local_fc6 == 0 || (local_4c1 = local_53b, local_4e0 == 0)))))) {
            local_4c1 = 1;
          }
          local_4dc = local_53c;
          local_4db = local_53b;
          local_4da = local_53a;
          local_4d9 = local_539;
          local_4c0 = local_4d8;
          local_4b0 = local_4d8;
          local_48c = local_4d8;
          local_474 = local_4d8;
          if (local_4c1 == 0) {
            local_518 = (gba_color_t *)((long)in_RDI + 0x26432);
            local_50c = 0;
            (*local_528)[local_54c] = *local_518;
            (*local_528)[local_54c].raw = (*local_528)[local_54c].raw & 0x7fff | 0x8000;
            local_508 = local_518;
          }
          else {
            switch(local_530->raw >> 0xe) {
            case 0:
              local_550 = 0;
              break;
            case 1:
              local_550 = (uint)(0xff < (int)(local_54c + local_534) % 0x200);
              break;
            case 2:
              local_550 = (uint)(0xff < (in_RDI->raw + local_538) % 0x200);
              break;
            case 3:
              iVar7 = 0;
              if (0xff < (in_RDI->raw + local_538) % 0x200) {
                iVar7 = 2;
              }
              local_550 = iVar7 + (uint)(0xff < (int)(local_54c + local_534) % 0x200);
              break;
            default:
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c"
                      ,0x161);
              fprintf(_stderr,"Unimplemented screen size: %d\n\x1b[0;m",
                      (ulong)(local_530->raw >> 0xe));
              exit(1);
            }
            local_554 = (int)(local_54c + local_534) % 0x100;
            local_558 = (in_RDI->raw + local_538) % 0x100;
            local_55c = local_554 / 8 + (local_558 / 8) * 0x20;
            local_500 = (uint8_t *)((long)in_RDI + 0x26832);
            local_4f4 = local_544 + local_550 * 0x800 + local_55c * 2;
            uVar1 = *(ushort *)(local_500 + local_4f4);
            local_548 = CONCAT22(local_548._2_2_,uVar1);
            local_2d5 = (local_530->raw >> 7 & 1) != 0;
            local_2c0 = local_548;
            local_2d4 = local_54c;
            local_2e8 = local_554 % 8;
            if ((uVar1 >> 10 & 1) != 0) {
              local_2e8 = 7 - local_2e8;
            }
            local_2ec = local_558 % 8;
            if ((uVar1 >> 0xb & 1) != 0) {
              local_2ec = 7 - local_2ec;
            }
            local_284 = (uint)(uVar1 & 0x3ff);
            local_288 = (uint)(uVar1 >> 0xc);
            local_294 = local_54c;
            local_2a0 = local_2e8;
            local_2a4 = local_2ec;
            local_2a8 = 2;
            if ((bool)local_2d5) {
              local_2a8 = 1;
            }
            local_2ac = 0x20;
            if ((bool)local_2d5) {
              local_2ac = 0x40;
            }
            local_2b0 = local_2e8 + local_2ec * 8;
            local_2b4 = local_2b0 / local_2a8 + local_540 + local_284 * local_2ac;
            local_2b5 = *(byte *)((long)in_RDI + (ulong)local_2b4 + 0x26832);
            if ((bool)local_2d5) {
              local_fd8 = (uint)local_2b5 << 1;
            }
            else {
              local_2b5 = (byte)((int)(uint)local_2b5 >> ((byte)(local_2b0 % 2 << 2) & 0x1f)) & 0xf;
              local_fd8 = local_288 * 0x20 + (uint)local_2b5 * 2;
            }
            local_2bc = local_fd8;
            local_278 = (uint8_t *)((long)in_RDI + 0x26432);
            local_26c = local_fd8;
            (*local_528)[local_54c] = *(gba_color_t *)(local_278 + local_fd8);
            (*local_528)[local_54c].raw =
                 (*local_528)[local_54c].raw & 0x7fff | (ushort)(local_2b5 == 0) << 0xf;
            local_4f0 = local_500;
            local_2e4 = local_558;
            local_2e0 = local_554;
            local_2dc = local_540;
            local_2d0 = local_528;
            local_29c = local_540;
            local_295 = local_2d5;
            local_290 = local_528;
            local_268 = local_278;
          }
        }
      }
      if ((in_RDI[0xfb0d].raw >> 0xb & 1) != 0) {
        local_438 = (gba_color_t (*) [240])((long)in_RDI + 0x25da2);
        local_440 = in_RDI + 0xfb11;
        local_449 = (byte)(in_RDI[0xfb26].raw >> 3) & 1;
        local_44a = (byte)(in_RDI[0xfb26].raw >> 0xb) & 1;
        local_44b = (byte)(((WINOUT_t *)((long)in_RDI + 0x3ec9a))->raw >> 3) & 1;
        local_44c = (byte)(((WINOUT_t *)((long)in_RDI + 0x3ec9a))->raw >> 0xb) & 1;
        local_444 = (uint)(in_RDI[0xfb18].raw & 0x1ff);
        local_448 = (uint)(in_RDI[0xfb19].raw & 0x1ff);
        local_450 = (uint)(local_440->raw >> 2 & 3) * 0x4000;
        local_454 = (uint)(local_440->raw >> 8 & 0x1f) * 0x800;
        for (local_45c = 0; local_45c < 0xf0; local_45c = local_45c + 1) {
          local_3e4 = local_45c;
          local_3e8 = (uint)in_RDI->raw;
          local_3cc = local_45c;
          local_380 = local_45c;
          local_388 = (uint)(in_RDI[0xfb22].raw >> 8);
          local_38c = (uint)(in_RDI[0xfb22].raw & 0xff);
          local_390 = (uint)(in_RDI[0xfb24].raw >> 8);
          local_394 = (uint)(in_RDI[0xfb24].raw & 0xff);
          local_fd9 = false;
          if (((int)local_388 <= local_45c) && (local_fd9 = false, local_45c <= (int)local_38c)) {
            local_fda = local_390 <= local_3e8 && local_3e8 <= local_394;
            local_fd9 = local_fda;
          }
          local_3ed = local_fd9;
          local_3bc = local_45c;
          local_398 = local_45c;
          local_3a0 = (uint)(in_RDI[0xfb23].raw >> 8);
          local_3a4 = (uint)(in_RDI[0xfb23].raw & 0xff);
          local_3a8 = (uint)(in_RDI[0xfb25].raw >> 8);
          local_3ac = (uint)(in_RDI[0xfb25].raw & 0xff);
          local_fdb = false;
          if (((int)local_3a0 <= local_45c) && (local_fdb = false, local_45c <= (int)local_3a4)) {
            local_fdc = local_3a8 <= local_3e8 && local_3e8 <= local_3ac;
            local_fdb = local_fdc;
          }
          local_3ee = local_fdb;
          local_3ef = *(byte *)((long)in_RDI + (long)local_45c + 0x26342) & 1;
          local_fdd = true;
          if (local_fd9 == false) {
            local_fdd = local_fdb;
          }
          local_3f0 = (local_fdd ^ 0xffU) & 1;
          local_3f1 = (byte)(in_RDI[0xfb0d].raw >> 0xd) & 1;
          local_3f2 = (byte)(in_RDI[0xfb0d].raw >> 0xe) & 1;
          local_3f3 = -(char)(in_RDI[0xfb0d].sraw >> 0xf);
          local_fde = 1;
          if (local_3f1 == 0) {
            local_fde = local_3f2;
          }
          local_3f4 = local_fde;
          if ((((local_3f1 == 0) || (local_3d1 = local_449, local_fd9 == false)) &&
              ((local_3f2 == 0 || (local_3d1 = local_44a, local_fdb == false)))) &&
             (((local_3f3 == '\0' || (local_3d1 = local_44c, local_3ef == 0)) &&
              ((local_fde == 0 || (local_3d1 = local_44b, local_3f0 == 0)))))) {
            local_3d1 = 1;
          }
          local_3ec = local_44c;
          local_3eb = local_44b;
          local_3ea = local_44a;
          local_3e9 = local_449;
          local_3d0 = local_3e8;
          local_3c0 = local_3e8;
          local_39c = local_3e8;
          local_384 = local_3e8;
          if (local_3d1 == 0) {
            local_428 = (gba_color_t *)((long)in_RDI + 0x26432);
            local_41c = 0;
            (*local_438)[local_45c] = *local_428;
            (*local_438)[local_45c].raw = (*local_438)[local_45c].raw & 0x7fff | 0x8000;
            local_418 = local_428;
          }
          else {
            switch(local_440->raw >> 0xe) {
            case 0:
              local_460 = 0;
              break;
            case 1:
              local_460 = (uint)(0xff < (int)(local_45c + local_444) % 0x200);
              break;
            case 2:
              local_460 = (uint)(0xff < (in_RDI->raw + local_448) % 0x200);
              break;
            case 3:
              iVar7 = 0;
              if (0xff < (in_RDI->raw + local_448) % 0x200) {
                iVar7 = 2;
              }
              local_460 = iVar7 + (uint)(0xff < (int)(local_45c + local_444) % 0x200);
              break;
            default:
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c"
                      ,0x161);
              fprintf(_stderr,"Unimplemented screen size: %d\n\x1b[0;m",
                      (ulong)(local_440->raw >> 0xe));
              exit(1);
            }
            local_464 = (int)(local_45c + local_444) % 0x100;
            local_468 = (in_RDI->raw + local_448) % 0x100;
            local_46c = local_464 / 8 + (local_468 / 8) * 0x20;
            local_410 = (uint8_t *)((long)in_RDI + 0x26832);
            local_404 = local_454 + local_460 * 0x800 + local_46c * 2;
            uVar1 = *(ushort *)(local_410 + local_404);
            local_458 = CONCAT22(local_458._2_2_,uVar1);
            local_365 = (local_440->raw >> 7 & 1) != 0;
            local_350 = local_458;
            local_364 = local_45c;
            local_378 = local_464 % 8;
            if ((uVar1 >> 10 & 1) != 0) {
              local_378 = 7 - local_378;
            }
            local_37c = local_468 % 8;
            if ((uVar1 >> 0xb & 1) != 0) {
              local_37c = 7 - local_37c;
            }
            local_314 = (uint)(uVar1 & 0x3ff);
            local_318 = (uint)(uVar1 >> 0xc);
            local_324 = local_45c;
            local_330 = local_378;
            local_334 = local_37c;
            local_338 = 2;
            if ((bool)local_365) {
              local_338 = 1;
            }
            local_33c = 0x20;
            if ((bool)local_365) {
              local_33c = 0x40;
            }
            local_340 = local_378 + local_37c * 8;
            local_344 = local_340 / local_338 + local_450 + local_314 * local_33c;
            local_345 = *(byte *)((long)in_RDI + (ulong)local_344 + 0x26832);
            if ((bool)local_365) {
              local_ff0 = (uint)local_345 << 1;
            }
            else {
              local_345 = (byte)((int)(uint)local_345 >> ((byte)(local_340 % 2 << 2) & 0x1f)) & 0xf;
              local_ff0 = local_318 * 0x20 + (uint)local_345 * 2;
            }
            local_34c = local_ff0;
            local_308 = (uint8_t *)((long)in_RDI + 0x26432);
            local_2fc = local_ff0;
            (*local_438)[local_45c] = *(gba_color_t *)(local_308 + local_ff0);
            (*local_438)[local_45c].raw =
                 (*local_438)[local_45c].raw & 0x7fff | (ushort)(local_345 == 0) << 0xf;
            local_400 = local_410;
            local_374 = local_468;
            local_370 = local_464;
            local_36c = local_450;
            local_360 = local_438;
            local_32c = local_450;
            local_325 = local_365;
            local_320 = local_438;
            local_2f8 = local_308;
          }
        }
      }
      dbg_line_drawn();
      refresh_background_priorities((gba_ppu_t *)&in_RDI->field_0);
      local_f10 = in_RDI;
      if ((in_RDI[0xfb29].raw & 0x1f) < 0x10) {
        local_ff4 = (uint)(in_RDI[0xfb29].raw & 0x1f);
      }
      else {
        local_ff4 = 0x10;
      }
      local_f11 = (undefined1)local_ff4;
      if ((in_RDI[0xfb29].raw >> 8 & 0x1f) < 0x10) {
        local_ff8 = (uint)(in_RDI[0xfb29].raw >> 8 & 0x1f);
      }
      else {
        local_ff8 = 0x10;
      }
      local_f12 = (undefined1)local_ff8;
      if ((in_RDI[0xfb2a].raw & 0x1f) < 0x10) {
        local_ffc = (uint)(in_RDI[0xfb2a].raw & 0x1f);
      }
      else {
        local_ffc = 0x10;
      }
      local_f13 = (char)local_ffc;
      local_f17[0] = (byte)(in_RDI[0xfb0d].raw >> 8) & 1;
      local_f17[1] = (byte)(in_RDI[0xfb0d].raw >> 9) & 1;
      local_f17[2] = (byte)(in_RDI[0xfb0d].raw >> 10) & 1;
      local_f17[3] = (byte)(in_RDI[0xfb0d].raw >> 0xb) & 1;
      local_f1d[0] = (byte)in_RDI[0xfb28].raw & 1;
      local_f1d[1] = (byte)(in_RDI[0xfb28].raw >> 1) & 1;
      local_f1d[2] = (byte)(in_RDI[0xfb28].raw >> 2) & 1;
      local_f1d[3] = (byte)(in_RDI[0xfb28].raw >> 3) & 1;
      local_f19 = (byte)(in_RDI[0xfb28].raw >> 4) & 1;
      local_f18 = (byte)(in_RDI[0xfb28].raw >> 5) & 1;
      local_f23[0] = (byte)(in_RDI[0xfb28].raw >> 8) & 1;
      local_f23[1] = (byte)(in_RDI[0xfb28].raw >> 9) & 1;
      local_f23[2] = (byte)(in_RDI[0xfb28].raw >> 10) & 1;
      local_f23[3] = (byte)(in_RDI[0xfb28].raw >> 0xb) & 1;
      local_f1f = (byte)(in_RDI[0xfb28].raw >> 0xc) & 1;
      local_f1e = (byte)(in_RDI[0xfb28].raw >> 0xd) & 1;
      for (local_f28 = 0; local_f28 < 0xf0; local_f28 = local_f28 + 1) {
        local_ef8 = (uint8_t *)((long)in_RDI + 0x26432);
        local_efc = 0;
        local_f08 = local_ef8;
        local_f32 = *(ushort *)local_ef8;
        local_f30 = 5;
        local_f33 = 1;
        local_ee8 = in_RDI;
        local_eec = local_f28;
        local_ef0 = (uint)in_RDI->raw;
        local_ea4 = local_f28;
        local_ea8 = local_ef0;
        local_eac = (uint)(in_RDI[0xfb22].raw >> 8);
        local_eb0 = (uint)(in_RDI[0xfb22].raw & 0xff);
        local_eb4 = (uint)(in_RDI[0xfb24].raw >> 8);
        local_eb8 = (uint)(in_RDI[0xfb24].raw & 0xff);
        local_ffe = false;
        if (((int)(uint)(in_RDI[0xfb22].raw >> 8) <= local_f28) &&
           (local_ffe = false, local_f28 <= (int)(uint)(in_RDI[0xfb22].raw & 0xff))) {
          local_ffe = in_RDI[0xfb24].raw >> 8 <= local_ef0 &&
                      local_ef0 <= (in_RDI[0xfb24].raw & 0xff);
        }
        local_ed8 = in_RDI;
        local_edc = local_f28;
        local_ee0 = (uint)in_RDI->raw;
        local_ebc = local_f28;
        local_ec0 = local_ee0;
        local_ec4 = (uint)(in_RDI[0xfb23].raw >> 8);
        local_ec8 = (uint)(in_RDI[0xfb23].raw & 0xff);
        local_ecc = (uint)(in_RDI[0xfb25].raw >> 8);
        local_ed0 = (uint)(in_RDI[0xfb25].raw & 0xff);
        local_1000 = false;
        if (((int)(uint)(in_RDI[0xfb23].raw >> 8) <= local_f28) &&
           (local_1000 = false, local_f28 <= (int)(uint)(in_RDI[0xfb23].raw & 0xff))) {
          local_1000 = in_RDI[0xfb25].raw >> 8 <= local_ee0 &&
                       local_ee0 <= (in_RDI[0xfb25].raw & 0xff);
        }
        bVar8 = true;
        if (!local_ffe) {
          bVar8 = local_1000;
        }
        bVar5 = (byte)(in_RDI[0xfb0d].raw >> 0xd) & 1;
        bVar6 = (byte)(in_RDI[0xfb0d].raw >> 0xe) & 1;
        local_1002 = 1;
        if (bVar5 == 0) {
          local_1002 = bVar6;
        }
        if ((local_ffe) && (bVar5 != 0)) {
          local_f33 = (byte)(in_RDI[0xfb26].raw >> 5) & 1;
        }
        else if ((local_1000) && (bVar6 != 0)) {
          local_f33 = (byte)(in_RDI[0xfb26].raw >> 0xd) & 1;
        }
        else if (((*(byte *)((long)in_RDI + (long)local_f28 + 0x26342) & 1) == 0) ||
                (-1 < in_RDI[0xfb0d].sraw)) {
          if ((!bVar8) && (local_1002 != 0)) {
            local_f33 = (byte)(((WINOUT_t *)((long)in_RDI + 0x3ec9a))->raw >> 5) & 1;
          }
        }
        else {
          local_f33 = (byte)(((WINOUT_t *)((long)in_RDI + 0x3ec9a))->raw >> 0xd) & 1;
        }
        local_f2a = local_f32;
        for (local_f40 = 3; -1 < (int)local_f40; local_f40 = local_f40 - 1) {
          iVar7 = background_priorities[(int)local_f40];
          local_f45 = local_f17[iVar7] & 1;
          bVar8 = true;
          if ((in_RDI[0xfb28].raw >> 6 & 3) != 3) {
            bVar8 = (in_RDI[0xfb28].raw >> 6 & 3) == 2;
          }
          bVar5 = local_f23[local_f30] & 1;
          local_1004 = 0;
          if ((in_RDI[0xfb28].raw >> 6 & 3) == 1) {
            local_1004 = bVar5;
          }
          bVar2 = false;
          if (((local_f33 != 0) && (bVar2 = false, (local_f1d[iVar7] & 1) != 0)) &&
             (bVar2 = true, local_1004 == 0)) {
            bVar2 = bVar8;
          }
          bVar3 = false;
          if (((*(byte *)((long)in_RDI + (long)local_f28 + 0x26252) & 1) != 0) &&
             (bVar3 = true, bVar5 == 0)) {
            bVar3 = bVar8;
          }
          uVar1 = *(ushort *)((long)in_RDI + (long)local_f28 * 2 + (long)iVar7 * 0x1e0 + 0x25802);
          if ((short)uVar1 < 0) {
            local_f45 = 0;
          }
          uVar4 = uVar1;
          if (((local_f45 == 0) || (!bVar2)) || ((short)uVar1 < 0)) {
            uVar4 = local_f2a;
            if (local_f45 != 0) {
              local_f32 = uVar1;
              local_f30 = iVar7;
              uVar4 = uVar1;
            }
          }
          else {
            local_f30 = iVar7;
            switch(in_RDI[0xfb28].raw >> 6 & 3) {
            case 0:
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c"
                      ,0x229);
              fprintf(_stderr,"Determined we should blend even though blending was off?\n\x1b[0;m");
              exit(1);
            case 1:
              local_e90 = local_f2a;
              local_e92 = uVar1;
              local_e93 = local_f12;
              local_e94 = local_f11;
              local_e98 = (local_f2a & 0x1f) * local_ff8 + (uVar1 & 0x1f) * local_ff4;
              local_e9c = (local_f2a >> 5 & 0x1f) * local_ff8 + (uVar1 >> 5 & 0x1f) * local_ff4;
              local_ea0 = (local_f2a >> 10 & 0x1f) * local_ff8 + (uVar1 >> 10 & 0x1f) * local_ff4;
              local_d5c = local_e98 >> 4;
              local_d58 = 0x1f;
              if (local_d5c < 0x20) {
                local_d54 = local_d5c;
              }
              else {
                local_d54 = 0x1f;
              }
              local_d68 = local_e9c >> 4;
              local_d64 = 0x1f;
              if (local_d68 < 0x20) {
                local_d60 = local_d68;
              }
              else {
                local_d60 = 0x1f;
              }
              local_d74 = local_ea0 >> 4;
              local_d70 = 0x1f;
              if (local_d74 < 0x20) {
                local_d6c = local_d74;
              }
              else {
                local_d6c = 0x1f;
              }
              local_f32 = local_e8e & 0x8000 | (ushort)local_d54 & 0x1f |
                          ((ushort)local_d60 & 0x1f) << 5 | ((ushort)local_d6c & 0x1f) << 10;
              local_e8e = local_f32;
              break;
            case 2:
              local_e80 = 0x10 - local_f13;
              local_e7c = white;
              local_e7e = uVar1;
              local_e7f = local_f13;
              local_e84 = (white.raw & 0x1f) * local_ffc + (uint)(uVar1 & 0x1f) * (uint)local_e80;
              local_e88 = (white.raw >> 5 & 0x1f) * local_ffc +
                          (uint)(uVar1 >> 5 & 0x1f) * (uint)local_e80;
              local_e8c = (white.raw >> 10 & 0x1f) * local_ffc +
                          (uint)(uVar1 >> 10 & 0x1f) * (uint)local_e80;
              local_d80 = local_e84 >> 4;
              local_d7c = 0x1f;
              if (local_d80 < 0x20) {
                local_d78 = local_d80;
              }
              else {
                local_d78 = 0x1f;
              }
              local_d8c = local_e88 >> 4;
              local_d88 = 0x1f;
              if (local_d8c < 0x20) {
                local_d84 = local_d8c;
              }
              else {
                local_d84 = 0x1f;
              }
              local_d98 = local_e8c >> 4;
              local_d94 = 0x1f;
              if (local_d98 < 0x20) {
                local_d90 = local_d98;
              }
              else {
                local_d90 = 0x1f;
              }
              local_f32 = local_e7a & 0x8000 | (ushort)local_d78 & 0x1f |
                          ((ushort)local_d84 & 0x1f) << 5 | ((ushort)local_d90 & 0x1f) << 10;
              local_e7a = local_f32;
              break;
            case 3:
              local_e6c = 0x10 - local_f13;
              local_e68 = black;
              local_e6a = uVar1;
              local_e6b = local_f13;
              local_e70 = (black.raw & 0x1f) * local_ffc + (uint)(uVar1 & 0x1f) * (uint)local_e6c;
              local_e74 = (black.raw >> 5 & 0x1f) * local_ffc +
                          (uint)(uVar1 >> 5 & 0x1f) * (uint)local_e6c;
              local_e78 = (black.raw >> 10 & 0x1f) * local_ffc +
                          (uint)(uVar1 >> 10 & 0x1f) * (uint)local_e6c;
              local_da4 = local_e70 >> 4;
              local_da0 = 0x1f;
              if (local_da4 < 0x20) {
                local_d9c = local_da4;
              }
              else {
                local_d9c = 0x1f;
              }
              local_db0 = local_e74 >> 4;
              local_dac = 0x1f;
              if (local_db0 < 0x20) {
                local_da8 = local_db0;
              }
              else {
                local_da8 = 0x1f;
              }
              local_dbc = local_e78 >> 4;
              local_db8 = 0x1f;
              if (local_dbc < 0x20) {
                local_db4 = local_dbc;
              }
              else {
                local_db4 = 0x1f;
              }
              local_f32 = local_e66 & 0x8000 | (ushort)local_d9c & 0x1f |
                          ((ushort)local_da8 & 0x1f) << 5 | ((ushort)local_db4 & 0x1f) << 10;
              local_e66 = local_f32;
            }
          }
          local_f2a = uVar4;
          if ((*(byte *)((long)in_RDI + (long)local_f28 + 0x26162) == local_f40) &&
             (-1 < *(short *)((long)in_RDI + (long)local_f28 * 2 + 0x25f82))) {
            uVar1 = *(ushort *)((long)in_RDI + (long)local_f28 * 2 + 0x25f82);
            uVar4 = uVar1;
            if (bVar3) {
              if (bVar5 == 0) {
                bVar5 = (byte)(in_RDI[0xfb28].raw >> 6) & 3;
              }
              else {
                bVar5 = 1;
              }
              uVar4 = local_f32;
              switch(bVar5) {
              case 0:
                fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                        "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c"
                        ,0x246);
                fprintf(_stderr,"Determined we should blend even though blending was off?\n\x1b[0;m"
                       );
                exit(1);
              case 1:
                local_e54 = local_f2a;
                local_e56 = uVar1;
                local_e57 = local_f12;
                local_e58 = local_f11;
                local_e5c = (local_f2a & 0x1f) * local_ff8 + (uVar1 & 0x1f) * local_ff4;
                local_e60 = (local_f2a >> 5 & 0x1f) * local_ff8 + (uVar1 >> 5 & 0x1f) * local_ff4;
                local_e64 = (local_f2a >> 10 & 0x1f) * local_ff8 + (uVar1 >> 10 & 0x1f) * local_ff4;
                local_dc8 = local_e5c >> 4;
                local_dc4 = 0x1f;
                if (local_dc8 < 0x20) {
                  local_dc0 = local_dc8;
                }
                else {
                  local_dc0 = 0x1f;
                }
                local_dd4 = local_e60 >> 4;
                local_dd0 = 0x1f;
                if (local_dd4 < 0x20) {
                  local_dcc = local_dd4;
                }
                else {
                  local_dcc = 0x1f;
                }
                local_de0 = local_e64 >> 4;
                local_ddc = 0x1f;
                if (local_de0 < 0x20) {
                  local_dd8 = local_de0;
                }
                else {
                  local_dd8 = 0x1f;
                }
                local_e52 = local_e52 & 0x8000 | (ushort)local_dc0 & 0x1f |
                            ((ushort)local_dcc & 0x1f) << 5 | ((ushort)local_dd8 & 0x1f) << 10;
                uVar4 = local_e52;
                break;
              case 2:
                local_e44 = 0x10 - local_f13;
                local_e40 = white;
                local_e42 = uVar1;
                local_e43 = local_f13;
                local_e48 = (white.raw & 0x1f) * local_ffc + (uint)(uVar1 & 0x1f) * (uint)local_e44;
                local_e4c = (white.raw >> 5 & 0x1f) * local_ffc +
                            (uint)(uVar1 >> 5 & 0x1f) * (uint)local_e44;
                local_e50 = (white.raw >> 10 & 0x1f) * local_ffc +
                            (uint)(uVar1 >> 10 & 0x1f) * (uint)local_e44;
                local_dec = local_e48 >> 4;
                local_de8 = 0x1f;
                if (local_dec < 0x20) {
                  local_de4 = local_dec;
                }
                else {
                  local_de4 = 0x1f;
                }
                local_df8 = local_e4c >> 4;
                local_df4 = 0x1f;
                if (local_df8 < 0x20) {
                  local_df0 = local_df8;
                }
                else {
                  local_df0 = 0x1f;
                }
                local_e04 = local_e50 >> 4;
                local_e00 = 0x1f;
                if (local_e04 < 0x20) {
                  local_dfc = local_e04;
                }
                else {
                  local_dfc = 0x1f;
                }
                local_e3e = local_e3e & 0x8000 | (ushort)local_de4 & 0x1f |
                            ((ushort)local_df0 & 0x1f) << 5 | ((ushort)local_dfc & 0x1f) << 10;
                uVar4 = local_e3e;
                break;
              case 3:
                local_e30 = 0x10 - local_f13;
                local_e2c = black;
                local_e2e = uVar1;
                local_e2f = local_f13;
                local_e34 = (black.raw & 0x1f) * local_ffc + (uint)(uVar1 & 0x1f) * (uint)local_e30;
                local_e38 = (black.raw >> 5 & 0x1f) * local_ffc +
                            (uint)(uVar1 >> 5 & 0x1f) * (uint)local_e30;
                local_e3c = (black.raw >> 10 & 0x1f) * local_ffc +
                            (uint)(uVar1 >> 10 & 0x1f) * (uint)local_e30;
                local_e10 = local_e34 >> 4;
                local_e0c = 0x1f;
                if (local_e10 < 0x20) {
                  local_e08 = local_e10;
                }
                else {
                  local_e08 = 0x1f;
                }
                local_e1c = local_e38 >> 4;
                local_e18 = 0x1f;
                if (local_e1c < 0x20) {
                  local_e14 = local_e1c;
                }
                else {
                  local_e14 = 0x1f;
                }
                local_e28 = local_e3c >> 4;
                local_e24 = 0x1f;
                if (local_e28 < 0x20) {
                  local_e20 = local_e28;
                }
                else {
                  local_e20 = 0x1f;
                }
                local_e2a = local_e2a & 0x8000 | (ushort)local_e08 & 0x1f |
                            ((ushort)local_e14 & 0x1f) << 5 | ((ushort)local_e20 & 0x1f) << 10;
                uVar4 = local_e2a;
              }
            }
            local_f32 = uVar4;
            local_f30 = 4;
            local_f2a = uVar1;
          }
        }
        *(undefined1 *)((long)in_RDI + (long)local_f28 * 4 + (ulong)in_RDI->raw * 0x3c0 + 2) = 0xff;
        *(byte *)((long)in_RDI + (long)local_f28 * 4 + (ulong)in_RDI->raw * 0x3c0 + 3) =
             (byte)local_f32 << 3 | (byte)local_f32 & 7;
        *(byte *)(in_RDI + (ulong)in_RDI->raw * 0xf0 + (long)local_f28 + 1) =
             (char)(local_f32 >> 5) << 3 | (byte)(local_f32 >> 5) & 7;
        bVar5 = (byte)(local_f32 >> 8);
        *(byte *)((long)in_RDI + (long)local_f28 * 4 + (ulong)in_RDI->raw * 0x3c0 + 5) =
             (bVar5 >> 2) << 3 | bVar5 >> 2 & 7;
      }
      break;
    case (bg_rotation_scaling_t *)0x1:
      local_d50 = in_RDI;
      if ((in_RDI[0xfb0d].raw >> 0xc & 1) != 0) {
        render_obj(in_stack_ffffffffffffef18);
      }
      if ((local_d50[0xfb0d].raw >> 8 & 1) != 0) {
        local_8e8 = (gba_color_t (*) [240])((long)local_d50 + 0x25802);
        local_8f0 = local_d50 + 0xfb0e;
        local_8f9 = (byte)local_d50[0xfb26].raw & 1;
        local_8fa = (byte)(local_d50[0xfb26].raw >> 8) & 1;
        local_8fb = (byte)((WINOUT_t *)((long)local_d50 + 0x3ec9a))->raw & 1;
        local_8fc = (byte)(((WINOUT_t *)((long)local_d50 + 0x3ec9a))->raw >> 8) & 1;
        local_8e0 = local_d50;
        local_8f4 = (uint)(local_d50[0xfb12].raw & 0x1ff);
        local_8f8 = (uint)(local_d50[0xfb13].raw & 0x1ff);
        local_900 = (uint)(local_8f0->raw >> 2 & 3) * 0x4000;
        local_904 = (uint)(local_8f0->raw >> 8 & 0x1f) * 0x800;
        for (local_90c = 0; local_90c < 0xf0; local_90c = local_90c + 1) {
          local_894 = local_90c;
          local_890 = local_d50;
          local_898 = (uint)local_d50->raw;
          local_87c = local_90c;
          local_878 = local_d50;
          local_830 = local_90c;
          local_838 = (uint)(local_d50[0xfb22].raw >> 8);
          local_83c = (uint)(local_d50[0xfb22].raw & 0xff);
          local_840 = (uint)(local_d50[0xfb24].raw >> 8);
          local_844 = (uint)(local_d50[0xfb24].raw & 0xff);
          local_1029 = false;
          if (((int)local_838 <= local_90c) && (local_1029 = false, local_90c <= (int)local_83c)) {
            local_102a = local_840 <= local_898 && local_898 <= local_844;
            local_1029 = local_102a;
          }
          local_89d = local_1029;
          local_86c = local_90c;
          local_868 = local_d50;
          local_848 = local_90c;
          local_850 = (uint)(local_d50[0xfb23].raw >> 8);
          local_854 = (uint)(local_d50[0xfb23].raw & 0xff);
          local_858 = (uint)(local_d50[0xfb25].raw >> 8);
          local_85c = (uint)(local_d50[0xfb25].raw & 0xff);
          local_102b = false;
          if (((int)local_850 <= local_90c) && (local_102b = false, local_90c <= (int)local_854)) {
            local_102c = local_858 <= local_898 && local_898 <= local_85c;
            local_102b = local_102c;
          }
          local_89e = local_102b;
          local_89f = *(byte *)((long)local_d50 + (long)local_90c + 0x26342) & 1;
          local_102d = true;
          if (local_1029 == false) {
            local_102d = local_102b;
          }
          local_8a0 = (local_102d ^ 0xffU) & 1;
          local_8a1 = (byte)(local_d50[0xfb0d].raw >> 0xd) & 1;
          local_8a2 = (byte)(local_d50[0xfb0d].raw >> 0xe) & 1;
          local_8a3 = -(char)(local_d50[0xfb0d].sraw >> 0xf);
          local_102e = 1;
          if (local_8a1 == 0) {
            local_102e = local_8a2;
          }
          local_8a4 = local_102e;
          if (((((local_8a1 == 0) || (local_881 = local_8f9, local_1029 == false)) &&
               ((local_8a2 == 0 || (local_881 = local_8fa, local_102b == false)))) &&
              ((local_8a3 == '\0' || (local_881 = local_8fc, local_89f == 0)))) &&
             ((local_102e == 0 || (local_881 = local_8fb, local_8a0 == 0)))) {
            local_881 = 1;
          }
          local_89c = local_8fc;
          local_89b = local_8fb;
          local_89a = local_8fa;
          local_899 = local_8f9;
          local_880 = local_898;
          local_870 = local_898;
          local_84c = local_898;
          local_834 = local_898;
          if (local_881 == 0) {
            local_8d8 = (gba_color_t *)((long)local_d50 + 0x26432);
            local_8cc = 0;
            (*local_8e8)[local_90c] = *local_8d8;
            (*local_8e8)[local_90c].raw = (*local_8e8)[local_90c].raw & 0x7fff | 0x8000;
            local_8c8 = local_8d8;
          }
          else {
            switch(local_8f0->raw >> 0xe) {
            case 0:
              local_910 = 0;
              break;
            case 1:
              local_910 = (uint)(0xff < (int)(local_90c + local_8f4) % 0x200);
              break;
            case 2:
              local_910 = (uint)(0xff < (local_d50->raw + local_8f8) % 0x200);
              break;
            case 3:
              iVar7 = 0;
              if (0xff < (local_d50->raw + local_8f8) % 0x200) {
                iVar7 = 2;
              }
              local_910 = iVar7 + (uint)(0xff < (int)(local_90c + local_8f4) % 0x200);
              break;
            default:
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c"
                      ,0x161);
              fprintf(_stderr,"Unimplemented screen size: %d\n\x1b[0;m",
                      (ulong)(local_8f0->raw >> 0xe));
              exit(1);
            }
            local_914 = (int)(local_90c + local_8f4) % 0x100;
            local_918 = (local_d50->raw + local_8f8) % 0x100;
            local_91c = local_914 / 8 + (local_918 / 8) * 0x20;
            local_8c0 = (uint8_t *)((long)local_d50 + 0x26832);
            local_8b4 = local_904 + local_910 * 0x800 + local_91c * 2;
            uVar1 = *(ushort *)(local_8c0 + local_8b4);
            local_908 = CONCAT22(local_908._2_2_,uVar1);
            local_95 = (local_8f0->raw >> 7 & 1) != 0;
            local_80 = local_908;
            local_88 = local_d50;
            local_94 = local_90c;
            local_a8 = local_914 % 8;
            if ((uVar1 >> 10 & 1) != 0) {
              local_a8 = 7 - local_a8;
            }
            local_ac = local_918 % 8;
            if ((uVar1 >> 0xb & 1) != 0) {
              local_ac = 7 - local_ac;
            }
            local_40 = local_d50;
            local_44 = (uint)(uVar1 & 0x3ff);
            local_48 = (uint)(uVar1 >> 0xc);
            local_54 = local_90c;
            local_60 = local_a8;
            local_64 = local_ac;
            local_68 = 2;
            if ((bool)local_95) {
              local_68 = 1;
            }
            local_6c = 0x20;
            if ((bool)local_95) {
              local_6c = 0x40;
            }
            local_70 = local_a8 + local_ac * 8;
            local_74 = local_70 / local_68 + local_900 + local_44 * local_6c;
            local_75 = *(byte *)((long)local_d50 + (ulong)local_74 + 0x26832);
            if ((bool)local_95) {
              local_1040 = (uint)local_75 << 1;
            }
            else {
              local_75 = (byte)((int)(uint)local_75 >> ((byte)(local_70 % 2 << 2) & 0x1f)) & 0xf;
              local_1040 = local_48 * 0x20 + (uint)local_75 * 2;
            }
            local_7c = local_1040;
            local_38 = (uint8_t *)((long)local_d50 + 0x26432);
            local_2c = local_1040;
            (*local_8e8)[local_90c] = *(gba_color_t *)(local_38 + local_1040);
            (*local_8e8)[local_90c].raw =
                 (*local_8e8)[local_90c].raw & 0x7fff | (ushort)(local_75 == 0) << 0xf;
            local_8b0 = local_8c0;
            local_a4 = local_918;
            local_a0 = local_914;
            local_9c = local_900;
            local_90 = local_8e8;
            local_5c = local_900;
            local_55 = local_95;
            local_50 = local_8e8;
            local_28 = local_38;
          }
        }
      }
      if ((local_d50[0xfb0d].raw >> 9 & 1) != 0) {
        local_7f8 = (gba_color_t (*) [240])((long)local_d50 + 0x259e2);
        local_800 = local_d50 + 0xfb0f;
        local_809 = (byte)(local_d50[0xfb26].raw >> 1) & 1;
        local_80a = (byte)(local_d50[0xfb26].raw >> 9) & 1;
        local_80b = (byte)(((WINOUT_t *)((long)local_d50 + 0x3ec9a))->raw >> 1) & 1;
        local_80c = (byte)(((WINOUT_t *)((long)local_d50 + 0x3ec9a))->raw >> 9) & 1;
        local_7f0 = local_d50;
        local_804 = (uint)(local_d50[0xfb14].raw & 0x1ff);
        local_808 = (uint)(local_d50[0xfb15].raw & 0x1ff);
        local_810 = (uint)(local_800->raw >> 2 & 3) * 0x4000;
        local_814 = (uint)(local_800->raw >> 8 & 0x1f) * 0x800;
        for (local_81c = 0; local_81c < 0xf0; local_81c = local_81c + 1) {
          local_7a4 = local_81c;
          local_7a0 = local_d50;
          local_7a8 = (uint)local_d50->raw;
          local_78c = local_81c;
          local_788 = local_d50;
          local_740 = local_81c;
          local_748 = (uint)(local_d50[0xfb22].raw >> 8);
          local_74c = (uint)(local_d50[0xfb22].raw & 0xff);
          local_750 = (uint)(local_d50[0xfb24].raw >> 8);
          local_754 = (uint)(local_d50[0xfb24].raw & 0xff);
          local_1041 = false;
          if (((int)local_748 <= local_81c) && (local_1041 = false, local_81c <= (int)local_74c)) {
            local_1042 = local_750 <= local_7a8 && local_7a8 <= local_754;
            local_1041 = local_1042;
          }
          local_7ad = local_1041;
          local_77c = local_81c;
          local_778 = local_d50;
          local_758 = local_81c;
          local_760 = (uint)(local_d50[0xfb23].raw >> 8);
          local_764 = (uint)(local_d50[0xfb23].raw & 0xff);
          local_768 = (uint)(local_d50[0xfb25].raw >> 8);
          local_76c = (uint)(local_d50[0xfb25].raw & 0xff);
          local_1043 = false;
          if (((int)local_760 <= local_81c) && (local_1043 = false, local_81c <= (int)local_764)) {
            local_1044 = local_768 <= local_7a8 && local_7a8 <= local_76c;
            local_1043 = local_1044;
          }
          local_7ae = local_1043;
          local_7af = *(byte *)((long)local_d50 + (long)local_81c + 0x26342) & 1;
          local_1045 = true;
          if (local_1041 == false) {
            local_1045 = local_1043;
          }
          local_7b0 = (local_1045 ^ 0xffU) & 1;
          local_7b1 = (byte)(local_d50[0xfb0d].raw >> 0xd) & 1;
          local_7b2 = (byte)(local_d50[0xfb0d].raw >> 0xe) & 1;
          local_7b3 = -(char)(local_d50[0xfb0d].sraw >> 0xf);
          local_1046 = 1;
          if (local_7b1 == 0) {
            local_1046 = local_7b2;
          }
          local_7b4 = local_1046;
          if ((((local_7b1 == 0) || (local_791 = local_809, local_1041 == false)) &&
              ((local_7b2 == 0 || (local_791 = local_80a, local_1043 == false)))) &&
             (((local_7b3 == '\0' || (local_791 = local_80c, local_7af == 0)) &&
              ((local_1046 == 0 || (local_791 = local_80b, local_7b0 == 0)))))) {
            local_791 = 1;
          }
          local_7ac = local_80c;
          local_7ab = local_80b;
          local_7aa = local_80a;
          local_7a9 = local_809;
          local_790 = local_7a8;
          local_780 = local_7a8;
          local_75c = local_7a8;
          local_744 = local_7a8;
          if (local_791 == 0) {
            local_7e8 = (gba_color_t *)((long)local_d50 + 0x26432);
            local_7dc = 0;
            (*local_7f8)[local_81c] = *local_7e8;
            (*local_7f8)[local_81c].raw = (*local_7f8)[local_81c].raw & 0x7fff | 0x8000;
            local_7d8 = local_7e8;
          }
          else {
            switch(local_800->raw >> 0xe) {
            case 0:
              local_820 = 0;
              break;
            case 1:
              local_820 = (uint)(0xff < (int)(local_81c + local_804) % 0x200);
              break;
            case 2:
              local_820 = (uint)(0xff < (local_d50->raw + local_808) % 0x200);
              break;
            case 3:
              iVar7 = 0;
              if (0xff < (local_d50->raw + local_808) % 0x200) {
                iVar7 = 2;
              }
              local_820 = iVar7 + (uint)(0xff < (int)(local_81c + local_804) % 0x200);
              break;
            default:
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c"
                      ,0x161);
              fprintf(_stderr,"Unimplemented screen size: %d\n\x1b[0;m",
                      (ulong)(local_800->raw >> 0xe));
              exit(1);
            }
            local_824 = (int)(local_81c + local_804) % 0x100;
            local_828 = (local_d50->raw + local_808) % 0x100;
            local_82c = local_824 / 8 + (local_828 / 8) * 0x20;
            local_7d0 = (uint8_t *)((long)local_d50 + 0x26832);
            local_7c4 = local_814 + local_820 * 0x800 + local_82c * 2;
            uVar1 = *(ushort *)(local_7d0 + local_7c4);
            local_818 = CONCAT22(local_818._2_2_,uVar1);
            local_125 = (local_800->raw >> 7 & 1) != 0;
            local_110 = local_818;
            local_118 = local_d50;
            local_124 = local_81c;
            local_138 = local_824 % 8;
            if ((uVar1 >> 10 & 1) != 0) {
              local_138 = 7 - local_138;
            }
            local_13c = local_828 % 8;
            if ((uVar1 >> 0xb & 1) != 0) {
              local_13c = 7 - local_13c;
            }
            local_d0 = local_d50;
            local_d4 = (uint)(uVar1 & 0x3ff);
            local_d8 = (uint)(uVar1 >> 0xc);
            local_e4 = local_81c;
            local_f0 = local_138;
            local_f4 = local_13c;
            local_f8 = 2;
            if ((bool)local_125) {
              local_f8 = 1;
            }
            local_fc = 0x20;
            if ((bool)local_125) {
              local_fc = 0x40;
            }
            local_100 = local_138 + local_13c * 8;
            local_104 = local_100 / local_f8 + local_810 + local_d4 * local_fc;
            local_105 = *(byte *)((long)local_d50 + (ulong)local_104 + 0x26832);
            if ((bool)local_125) {
              local_1058 = (uint)local_105 << 1;
            }
            else {
              local_105 = (byte)((int)(uint)local_105 >> ((byte)(local_100 % 2 << 2) & 0x1f)) & 0xf;
              local_1058 = local_d8 * 0x20 + (uint)local_105 * 2;
            }
            local_10c = local_1058;
            local_c8 = (uint8_t *)((long)local_d50 + 0x26432);
            local_bc = local_1058;
            (*local_7f8)[local_81c] = *(gba_color_t *)(local_c8 + local_1058);
            (*local_7f8)[local_81c].raw =
                 (*local_7f8)[local_81c].raw & 0x7fff | (ushort)(local_105 == 0) << 0xf;
            local_7c0 = local_7d0;
            local_134 = local_828;
            local_130 = local_824;
            local_12c = local_810;
            local_120 = local_7f8;
            local_ec = local_810;
            local_e5 = local_125;
            local_e0 = local_7f8;
            local_b8 = local_c8;
          }
        }
      }
      if ((local_d50[0xfb0d].raw >> 10 & 1) != 0) {
        render_bg_affine((gba_ppu_t *)
                         CONCAT17(in_stack_ffffffffffffef5f,
                                  CONCAT16(in_stack_ffffffffffffef5e,
                                           CONCAT15(in_stack_ffffffffffffef5d,
                                                    CONCAT14(in_stack_ffffffffffffef5c,
                                                             CONCAT13(in_stack_ffffffffffffef5b,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffef5a,
                                                  CONCAT11(in_stack_ffffffffffffef59,
                                                           in_stack_ffffffffffffef58))))))),
                         (gba_color_t (*) [240])
                         CONCAT17(in_stack_ffffffffffffef57,in_stack_ffffffffffffef50),
                         in_stack_ffffffffffffef48,SUB41((uint)in_stack_ffffffffffffef44 >> 0x18,0),
                         SUB41((uint)in_stack_ffffffffffffef44 >> 0x10,0),
                         SUB41((uint)in_stack_ffffffffffffef44 >> 8,0),
                         SUB41(in_stack_ffffffffffffef44,0),
                         (bg_referencepoint_container_t *)
                         CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                         in_stack_fffffffffffff060,
                         (bg_rotation_scaling_t *)
                         CONCAT17(in_stack_fffffffffffff06f,
                                  CONCAT16(in_stack_fffffffffffff06e,
                                           CONCAT15(in_stack_fffffffffffff06d,
                                                    CONCAT14(in_stack_fffffffffffff06c,
                                                             CONCAT13(in_stack_fffffffffffff06b,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff06a,
                                                  in_stack_fffffffffffff068)))))),pb,
                         (bg_rotation_scaling_t *)CONCAT17(uVar9,in_stack_fffffffffffff078),in_RDI);
      }
      dbg_line_drawn();
      refresh_background_priorities((gba_ppu_t *)&local_d50->field_0);
      local_cf8 = local_d50;
      if ((local_d50[0xfb29].raw & 0x1f) < 0x10) {
        local_105c = (uint)(local_d50[0xfb29].raw & 0x1f);
      }
      else {
        local_105c = 0x10;
      }
      local_cf9 = (undefined1)local_105c;
      if ((local_d50[0xfb29].raw >> 8 & 0x1f) < 0x10) {
        local_1060 = (uint)(local_d50[0xfb29].raw >> 8 & 0x1f);
      }
      else {
        local_1060 = 0x10;
      }
      local_cfa = (undefined1)local_1060;
      if ((local_d50[0xfb2a].raw & 0x1f) < 0x10) {
        local_1064 = (uint)(local_d50[0xfb2a].raw & 0x1f);
      }
      else {
        local_1064 = 0x10;
      }
      local_cfb = (char)local_1064;
      local_cff[0] = (byte)(local_d50[0xfb0d].raw >> 8) & 1;
      local_cff[1] = (byte)(local_d50[0xfb0d].raw >> 9) & 1;
      local_cff[2] = (byte)(local_d50[0xfb0d].raw >> 10) & 1;
      local_cff[3] = (byte)(local_d50[0xfb0d].raw >> 0xb) & 1;
      local_d05[0] = (byte)local_d50[0xfb28].raw & 1;
      local_d05[1] = (byte)(local_d50[0xfb28].raw >> 1) & 1;
      local_d05[2] = (byte)(local_d50[0xfb28].raw >> 2) & 1;
      local_d05[3] = (byte)(local_d50[0xfb28].raw >> 3) & 1;
      local_d01 = (byte)(local_d50[0xfb28].raw >> 4) & 1;
      local_d00 = (byte)(local_d50[0xfb28].raw >> 5) & 1;
      local_d0b[0] = (byte)(local_d50[0xfb28].raw >> 8) & 1;
      local_d0b[1] = (byte)(local_d50[0xfb28].raw >> 9) & 1;
      local_d0b[2] = (byte)(local_d50[0xfb28].raw >> 10) & 1;
      local_d0b[3] = (byte)(local_d50[0xfb28].raw >> 0xb) & 1;
      local_d07 = (byte)(local_d50[0xfb28].raw >> 0xc) & 1;
      local_d06 = (byte)(local_d50[0xfb28].raw >> 0xd) & 1;
      for (local_d10 = 0; local_d10 < 0xf0; local_d10 = local_d10 + 1) {
        local_ce0 = (ushort *)((long)local_d50 + 0x26432);
        local_ce4 = 0;
        local_cf0 = local_ce0;
        local_d12 = *local_ce0;
        local_d18 = 5;
        local_d1a = *local_ce0;
        local_d1b = 1;
        local_cd0 = local_d50;
        local_cd4 = local_d10;
        local_cd8 = (uint)local_d50->raw;
        local_c8c = local_d10;
        local_c90 = local_cd8;
        local_c94 = (uint)(local_d50[0xfb22].raw >> 8);
        local_c98 = (uint)(local_d50[0xfb22].raw & 0xff);
        local_c9c = (uint)(local_d50[0xfb24].raw >> 8);
        local_ca0 = (uint)(local_d50[0xfb24].raw & 0xff);
        local_1065 = false;
        if (((int)(uint)(local_d50[0xfb22].raw >> 8) <= local_d10) &&
           (local_1065 = false, local_d10 <= (int)(uint)(local_d50[0xfb22].raw & 0xff))) {
          local_1066 = local_d50[0xfb24].raw >> 8 <= local_cd8 &&
                       local_cd8 <= (local_d50[0xfb24].raw & 0xff);
          local_1065 = local_1066;
        }
        local_d1c = local_1065;
        local_cc0 = local_d50;
        local_cc4 = local_d10;
        local_cc8 = (uint)local_d50->raw;
        local_ca4 = local_d10;
        local_ca8 = local_cc8;
        local_cac = (uint)(local_d50[0xfb23].raw >> 8);
        local_cb0 = (uint)(local_d50[0xfb23].raw & 0xff);
        local_cb4 = (uint)(local_d50[0xfb25].raw >> 8);
        local_cb8 = (uint)(local_d50[0xfb25].raw & 0xff);
        local_1067 = false;
        if (((int)(uint)(local_d50[0xfb23].raw >> 8) <= local_d10) &&
           (local_1067 = false, local_d10 <= (int)(uint)(local_d50[0xfb23].raw & 0xff))) {
          local_1068 = local_d50[0xfb25].raw >> 8 <= local_cc8 &&
                       local_cc8 <= (local_d50[0xfb25].raw & 0xff);
          local_1067 = local_1068;
        }
        local_d1d = local_1067;
        local_1069 = true;
        if (local_1065 == false) {
          local_1069 = local_1067;
        }
        local_d1e = (local_1069 ^ 0xffU) & 1;
        local_d1f = (byte)(local_d50[0xfb0d].raw >> 0xd) & 1;
        local_d20 = (byte)(local_d50[0xfb0d].raw >> 0xe) & 1;
        local_d21 = -(char)(local_d50[0xfb0d].sraw >> 0xf);
        local_106a = 1;
        if (local_d1f == 0) {
          local_106a = local_d20;
        }
        local_d22 = local_106a;
        if ((local_1065 == false) || (local_d1f == 0)) {
          if ((local_1067 == false) || (local_d20 == 0)) {
            if (((*(byte *)((long)local_d50 + (long)local_d10 + 0x26342) & 1) == 0) ||
               (local_d21 == '\0')) {
              if ((local_d1e != 0) && (local_106a != 0)) {
                local_d1b = (byte)(*(ushort *)((long)local_d50 + 0x3ec9a) >> 5) & 1;
              }
            }
            else {
              local_d1b = (byte)(*(ushort *)((long)local_d50 + 0x3ec9a) >> 0xd) & 1;
            }
          }
          else {
            local_d1b = (byte)(local_d50[0xfb26].raw >> 0xd) & 1;
          }
        }
        else {
          local_d1b = (byte)(local_d50[0xfb26].raw >> 5) & 1;
        }
        for (local_d28 = 3; -1 < (int)local_d28; local_d28 = local_d28 - 1) {
          local_d2c = background_priorities[(int)local_d28];
          local_d2d = local_cff[local_d2c] & 1;
          local_106b = true;
          if ((local_d50[0xfb28].raw >> 6 & 3) != 3) {
            local_106b = (local_d50[0xfb28].raw >> 6 & 3) == 2;
          }
          local_d2e = local_106b;
          local_d2f = local_d0b[local_d18] & 1;
          local_106c = 0;
          if ((local_d50[0xfb28].raw >> 6 & 3) == 1) {
            local_106c = local_d2f;
          }
          local_d30 = local_106c;
          local_106d = false;
          if (local_d1b != 0) {
            local_106e = false;
            if ((local_d05[local_d2c] & 1) != 0) {
              local_106f = true;
              if (local_106c == 0) {
                local_106f = local_106b;
              }
              local_106e = local_106f;
            }
            local_106d = local_106e;
          }
          local_d31 = local_106d;
          local_1070 = false;
          if ((*(byte *)((long)local_d50 + (long)local_d10 + 0x26252) & 1) != 0) {
            local_1071 = true;
            if (local_d2f == 0) {
              local_1071 = local_106b;
            }
            local_1070 = local_1071;
          }
          local_d32 = local_1070;
          local_d33 = local_d2f;
          local_d36 = *(ushort *)
                       ((long)local_d50 + (long)local_d10 * 2 + (long)local_d2c * 0x1e0 + 0x25802);
          if ((short)local_d36 < 0) {
            local_d2d = 0;
          }
          if (((local_d2d == 0) || (local_106d == false)) || ((short)local_d36 < 0)) {
            if (local_d2d != 0) {
              local_d12 = local_d36;
              local_d1a = local_d36;
              local_d18 = local_d2c;
            }
          }
          else {
            switch(local_d50[0xfb28].raw >> 6 & 3) {
            case 0:
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c"
                      ,0x229);
              fprintf(_stderr,"Determined we should blend even though blending was off?\n\x1b[0;m");
              exit(1);
            case 1:
              local_c78 = local_d12;
              local_c7a = local_d36;
              local_c7b = local_cfa;
              local_c7c = local_cf9;
              local_c80 = (local_d12 & 0x1f) * local_1060 + (local_d36 & 0x1f) * local_105c;
              local_c84 = (local_d12 >> 5 & 0x1f) * local_1060 +
                          (local_d36 >> 5 & 0x1f) * local_105c;
              local_c88 = (local_d12 >> 10 & 0x1f) * local_1060 +
                          (local_d36 >> 10 & 0x1f) * local_105c;
              local_b44 = local_c80 >> 4;
              local_b40 = 0x1f;
              if (local_b44 < 0x20) {
                local_b3c = local_b44;
              }
              else {
                local_b3c = 0x1f;
              }
              local_b50 = local_c84 >> 4;
              local_b4c = 0x1f;
              if (local_b50 < 0x20) {
                local_b48 = local_b50;
              }
              else {
                local_b48 = 0x1f;
              }
              local_b5c = local_c88 >> 4;
              local_b58 = 0x1f;
              if (local_b5c < 0x20) {
                local_b54 = local_b5c;
              }
              else {
                local_b54 = 0x1f;
              }
              local_c76 = local_c76 & 0x8000 | (ushort)local_b3c & 0x1f |
                          ((ushort)local_b48 & 0x1f) << 5 | ((ushort)local_b54 & 0x1f) << 10;
              local_d38 = local_c76;
              local_d1a = local_c76;
              break;
            case 2:
              local_c68 = 0x10 - local_cfb;
              local_c64 = white;
              local_c66 = local_d36;
              local_c67 = local_cfb;
              local_c6c = (white.raw & 0x1f) * local_1064 +
                          (uint)(local_d36 & 0x1f) * (uint)local_c68;
              local_c70 = (white.raw >> 5 & 0x1f) * local_1064 +
                          (uint)(local_d36 >> 5 & 0x1f) * (uint)local_c68;
              local_c74 = (white.raw >> 10 & 0x1f) * local_1064 +
                          (uint)(local_d36 >> 10 & 0x1f) * (uint)local_c68;
              local_b68 = local_c6c >> 4;
              local_b64 = 0x1f;
              if (local_b68 < 0x20) {
                local_b60 = local_b68;
              }
              else {
                local_b60 = 0x1f;
              }
              local_b74 = local_c70 >> 4;
              local_b70 = 0x1f;
              if (local_b74 < 0x20) {
                local_b6c = local_b74;
              }
              else {
                local_b6c = 0x1f;
              }
              local_b80 = local_c74 >> 4;
              local_b7c = 0x1f;
              if (local_b80 < 0x20) {
                local_b78 = local_b80;
              }
              else {
                local_b78 = 0x1f;
              }
              local_c62 = local_c62 & 0x8000 | (ushort)local_b60 & 0x1f |
                          ((ushort)local_b6c & 0x1f) << 5 | ((ushort)local_b78 & 0x1f) << 10;
              local_d3a = local_c62;
              local_d1a = local_c62;
              break;
            case 3:
              local_c54 = 0x10 - local_cfb;
              local_c50 = black;
              local_c52 = local_d36;
              local_c53 = local_cfb;
              local_c58 = (black.raw & 0x1f) * local_1064 +
                          (uint)(local_d36 & 0x1f) * (uint)local_c54;
              local_c5c = (black.raw >> 5 & 0x1f) * local_1064 +
                          (uint)(local_d36 >> 5 & 0x1f) * (uint)local_c54;
              local_c60 = (black.raw >> 10 & 0x1f) * local_1064 +
                          (uint)(local_d36 >> 10 & 0x1f) * (uint)local_c54;
              local_b8c = local_c58 >> 4;
              local_b88 = 0x1f;
              if (local_b8c < 0x20) {
                local_b84 = local_b8c;
              }
              else {
                local_b84 = 0x1f;
              }
              local_b98 = local_c5c >> 4;
              local_b94 = 0x1f;
              if (local_b98 < 0x20) {
                local_b90 = local_b98;
              }
              else {
                local_b90 = 0x1f;
              }
              local_ba4 = local_c60 >> 4;
              local_ba0 = 0x1f;
              if (local_ba4 < 0x20) {
                local_b9c = local_ba4;
              }
              else {
                local_b9c = 0x1f;
              }
              local_c4e = local_c4e & 0x8000 | (ushort)local_b84 & 0x1f |
                          ((ushort)local_b90 & 0x1f) << 5 | ((ushort)local_b9c & 0x1f) << 10;
              local_d3c = local_c4e;
              local_d1a = local_c4e;
            }
            local_d18 = local_d2c;
            local_d12 = local_d36;
          }
          if ((*(byte *)((long)local_d50 + (long)local_d10 + 0x26162) == local_d28) &&
             (-1 < *(short *)((long)local_d50 + (long)local_d10 * 2 + 0x25f82))) {
            local_d36 = *(ushort *)((long)local_d50 + (long)local_d10 * 2 + 0x25f82);
            if (local_1070 == false) {
              local_d1a = local_d36;
            }
            else {
              if (local_d2f == 0) {
                local_d3d = (byte)(local_d50[0xfb28].raw >> 6) & 3;
              }
              else {
                local_d3d = 1;
              }
              switch(local_d3d) {
              case 0:
                fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                        "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c"
                        ,0x246);
                fprintf(_stderr,"Determined we should blend even though blending was off?\n\x1b[0;m"
                       );
                exit(1);
              case 1:
                local_c3c = local_d12;
                local_c3e = local_d36;
                local_c3f = local_cfa;
                local_c40 = local_cf9;
                local_c44 = (local_d12 & 0x1f) * local_1060 + (local_d36 & 0x1f) * local_105c;
                local_c48 = (local_d12 >> 5 & 0x1f) * local_1060 +
                            (local_d36 >> 5 & 0x1f) * local_105c;
                local_c4c = (local_d12 >> 10 & 0x1f) * local_1060 +
                            (local_d36 >> 10 & 0x1f) * local_105c;
                local_bb0 = local_c44 >> 4;
                local_bac = 0x1f;
                if (local_bb0 < 0x20) {
                  local_ba8 = local_bb0;
                }
                else {
                  local_ba8 = 0x1f;
                }
                local_bbc = local_c48 >> 4;
                local_bb8 = 0x1f;
                if (local_bbc < 0x20) {
                  local_bb4 = local_bbc;
                }
                else {
                  local_bb4 = 0x1f;
                }
                local_bc8 = local_c4c >> 4;
                local_bc4 = 0x1f;
                if (local_bc8 < 0x20) {
                  local_bc0 = local_bc8;
                }
                else {
                  local_bc0 = 0x1f;
                }
                local_c3a = local_c3a & 0x8000 | (ushort)local_ba8 & 0x1f |
                            ((ushort)local_bb4 & 0x1f) << 5 | ((ushort)local_bc0 & 0x1f) << 10;
                local_d40 = local_c3a;
                local_d1a = local_c3a;
                break;
              case 2:
                local_c2c = 0x10 - local_cfb;
                local_c28 = white;
                local_c2a = local_d36;
                local_c2b = local_cfb;
                local_c30 = (white.raw & 0x1f) * local_1064 +
                            (uint)(local_d36 & 0x1f) * (uint)local_c2c;
                local_c34 = (white.raw >> 5 & 0x1f) * local_1064 +
                            (uint)(local_d36 >> 5 & 0x1f) * (uint)local_c2c;
                local_c38 = (white.raw >> 10 & 0x1f) * local_1064 +
                            (uint)(local_d36 >> 10 & 0x1f) * (uint)local_c2c;
                local_bd4 = local_c30 >> 4;
                local_bd0 = 0x1f;
                if (local_bd4 < 0x20) {
                  local_bcc = local_bd4;
                }
                else {
                  local_bcc = 0x1f;
                }
                local_be0 = local_c34 >> 4;
                local_bdc = 0x1f;
                if (local_be0 < 0x20) {
                  local_bd8 = local_be0;
                }
                else {
                  local_bd8 = 0x1f;
                }
                local_bec = local_c38 >> 4;
                local_be8 = 0x1f;
                if (local_bec < 0x20) {
                  local_be4 = local_bec;
                }
                else {
                  local_be4 = 0x1f;
                }
                local_c26 = local_c26 & 0x8000 | (ushort)local_bcc & 0x1f |
                            ((ushort)local_bd8 & 0x1f) << 5 | ((ushort)local_be4 & 0x1f) << 10;
                local_d42 = local_c26;
                local_d1a = local_c26;
                break;
              case 3:
                local_c18 = 0x10 - local_cfb;
                local_c14 = black;
                local_c16 = local_d36;
                local_c17 = local_cfb;
                local_c1c = (black.raw & 0x1f) * local_1064 +
                            (uint)(local_d36 & 0x1f) * (uint)local_c18;
                local_c20 = (black.raw >> 5 & 0x1f) * local_1064 +
                            (uint)(local_d36 >> 5 & 0x1f) * (uint)local_c18;
                local_c24 = (black.raw >> 10 & 0x1f) * local_1064 +
                            (uint)(local_d36 >> 10 & 0x1f) * (uint)local_c18;
                local_bf8 = local_c1c >> 4;
                local_bf4 = 0x1f;
                if (local_bf8 < 0x20) {
                  local_bf0 = local_bf8;
                }
                else {
                  local_bf0 = 0x1f;
                }
                local_c04 = local_c20 >> 4;
                local_c00 = 0x1f;
                if (local_c04 < 0x20) {
                  local_bfc = local_c04;
                }
                else {
                  local_bfc = 0x1f;
                }
                local_c10 = local_c24 >> 4;
                local_c0c = 0x1f;
                if (local_c10 < 0x20) {
                  local_c08 = local_c10;
                }
                else {
                  local_c08 = 0x1f;
                }
                local_c12 = local_c12 & 0x8000 | (ushort)local_bf0 & 0x1f |
                            ((ushort)local_bfc & 0x1f) << 5 | ((ushort)local_c08 & 0x1f) << 10;
                local_d44 = local_c12;
                local_d1a = local_c12;
              }
            }
            local_d12 = local_d36;
            local_d18 = 4;
          }
        }
        *(undefined1 *)((long)local_d50 + (long)local_d10 * 4 + (ulong)local_d50->raw * 0x3c0 + 2) =
             0xff;
        *(byte *)((long)local_d50 + (long)local_d10 * 4 + (ulong)local_d50->raw * 0x3c0 + 3) =
             (byte)local_d1a << 3 | (byte)local_d1a & 7;
        *(byte *)(local_d50 + (ulong)local_d50->raw * 0xf0 + (long)local_d10 + 1) =
             (char)(local_d1a >> 5) << 3 | (byte)(local_d1a >> 5) & 7;
        bVar5 = (byte)(local_d1a >> 8);
        *(byte *)((long)local_d50 + (long)local_d10 * 4 + (ulong)local_d50->raw * 0x3c0 + 5) =
             (bVar5 >> 2) << 3 | bVar5 >> 2 & 7;
      }
      break;
    case (bg_rotation_scaling_t *)0x2:
      local_b38 = in_RDI;
      if ((in_RDI[0xfb0d].raw >> 0xc & 1) != 0) {
        render_obj(in_stack_ffffffffffffef18);
      }
      if ((local_b38[0xfb0d].raw >> 10 & 1) != 0) {
        render_bg_affine((gba_ppu_t *)
                         CONCAT17(in_stack_ffffffffffffef5f,
                                  CONCAT16(in_stack_ffffffffffffef5e,
                                           CONCAT15(in_stack_ffffffffffffef5d,
                                                    CONCAT14(in_stack_ffffffffffffef5c,
                                                             CONCAT13(in_stack_ffffffffffffef5b,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffef5a,
                                                  CONCAT11(in_stack_ffffffffffffef59,
                                                           in_stack_ffffffffffffef58))))))),
                         (gba_color_t (*) [240])
                         CONCAT17(in_stack_ffffffffffffef57,in_stack_ffffffffffffef50),
                         in_stack_ffffffffffffef48,SUB41((uint)in_stack_ffffffffffffef44 >> 0x18,0),
                         SUB41((uint)in_stack_ffffffffffffef44 >> 0x10,0),
                         SUB41((uint)in_stack_ffffffffffffef44 >> 8,0),
                         SUB41(in_stack_ffffffffffffef44,0),
                         (bg_referencepoint_container_t *)
                         CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                         in_stack_fffffffffffff060,
                         (bg_rotation_scaling_t *)
                         CONCAT17(in_stack_fffffffffffff06f,
                                  CONCAT16(in_stack_fffffffffffff06e,
                                           CONCAT15(in_stack_fffffffffffff06d,
                                                    CONCAT14(in_stack_fffffffffffff06c,
                                                             CONCAT13(in_stack_fffffffffffff06b,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff06a,
                                                  in_stack_fffffffffffff068)))))),pb,
                         (bg_rotation_scaling_t *)CONCAT17(uVar9,in_stack_fffffffffffff078),in_RDI);
      }
      if ((local_b38[0xfb0d].raw >> 0xb & 1) != 0) {
        render_bg_affine((gba_ppu_t *)
                         CONCAT17(in_stack_ffffffffffffef5f,
                                  CONCAT16(in_stack_ffffffffffffef5e,
                                           CONCAT15(in_stack_ffffffffffffef5d,
                                                    CONCAT14(in_stack_ffffffffffffef5c,
                                                             CONCAT13(in_stack_ffffffffffffef5b,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffef5a,
                                                  CONCAT11(in_stack_ffffffffffffef59,
                                                           in_stack_ffffffffffffef58))))))),
                         (gba_color_t (*) [240])
                         CONCAT17(in_stack_ffffffffffffef57,in_stack_ffffffffffffef50),
                         in_stack_ffffffffffffef48,SUB41((uint)in_stack_ffffffffffffef44 >> 0x18,0),
                         SUB41((uint)in_stack_ffffffffffffef44 >> 0x10,0),
                         SUB41((uint)in_stack_ffffffffffffef44 >> 8,0),
                         SUB41(in_stack_ffffffffffffef44,0),
                         (bg_referencepoint_container_t *)
                         CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                         in_stack_fffffffffffff060,
                         (bg_rotation_scaling_t *)
                         CONCAT17(in_stack_fffffffffffff06f,
                                  CONCAT16(in_stack_fffffffffffff06e,
                                           CONCAT15(in_stack_fffffffffffff06d,
                                                    CONCAT14(in_stack_fffffffffffff06c,
                                                             CONCAT13(in_stack_fffffffffffff06b,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff06a,
                                                  in_stack_fffffffffffff068)))))),pb,
                         (bg_rotation_scaling_t *)CONCAT17(uVar9,in_stack_fffffffffffff078),in_RDI);
      }
      dbg_line_drawn();
      refresh_background_priorities((gba_ppu_t *)&local_b38->field_0);
      local_ae0 = local_b38;
      if ((local_b38[0xfb29].raw & 0x1f) < 0x10) {
        local_1094 = (uint)(local_b38[0xfb29].raw & 0x1f);
      }
      else {
        local_1094 = 0x10;
      }
      local_ae1 = (undefined1)local_1094;
      if ((local_b38[0xfb29].raw >> 8 & 0x1f) < 0x10) {
        local_1098 = (uint)(local_b38[0xfb29].raw >> 8 & 0x1f);
      }
      else {
        local_1098 = 0x10;
      }
      local_ae2 = (undefined1)local_1098;
      if ((local_b38[0xfb2a].raw & 0x1f) < 0x10) {
        local_109c = (uint)(local_b38[0xfb2a].raw & 0x1f);
      }
      else {
        local_109c = 0x10;
      }
      local_ae3 = (char)local_109c;
      local_ae7[0] = (byte)(local_b38[0xfb0d].raw >> 8) & 1;
      local_ae7[1] = (byte)(local_b38[0xfb0d].raw >> 9) & 1;
      local_ae7[2] = (byte)(local_b38[0xfb0d].raw >> 10) & 1;
      local_ae7[3] = (byte)(local_b38[0xfb0d].raw >> 0xb) & 1;
      local_aed[0] = (byte)local_b38[0xfb28].raw & 1;
      local_aed[1] = (byte)(local_b38[0xfb28].raw >> 1) & 1;
      local_aed[2] = (byte)(local_b38[0xfb28].raw >> 2) & 1;
      local_aed[3] = (byte)(local_b38[0xfb28].raw >> 3) & 1;
      local_ae9 = (byte)(local_b38[0xfb28].raw >> 4) & 1;
      local_ae8 = (byte)(local_b38[0xfb28].raw >> 5) & 1;
      local_af3[0] = (byte)(local_b38[0xfb28].raw >> 8) & 1;
      local_af3[1] = (byte)(local_b38[0xfb28].raw >> 9) & 1;
      local_af3[2] = (byte)(local_b38[0xfb28].raw >> 10) & 1;
      local_af3[3] = (byte)(local_b38[0xfb28].raw >> 0xb) & 1;
      local_aef = (byte)(local_b38[0xfb28].raw >> 0xc) & 1;
      local_aee = (byte)(local_b38[0xfb28].raw >> 0xd) & 1;
      for (local_af8 = 0; local_af8 < 0xf0; local_af8 = local_af8 + 1) {
        local_ac8 = (ushort *)((long)local_b38 + 0x26432);
        local_acc = 0;
        local_ad8 = local_ac8;
        local_afa = *local_ac8;
        local_b00 = 5;
        local_b02 = *local_ac8;
        local_b03 = 1;
        local_ab8 = local_b38;
        local_abc = local_af8;
        local_ac0 = (uint)local_b38->raw;
        local_a70 = local_af8;
        local_a74 = local_ac0;
        local_a78 = (uint)(local_b38[0xfb22].raw >> 8);
        local_a7c = (uint)(local_b38[0xfb22].raw & 0xff);
        local_a80 = (uint)(local_b38[0xfb24].raw >> 8);
        local_a84 = (uint)(local_b38[0xfb24].raw & 0xff);
        local_109d = false;
        if (((int)(uint)(local_b38[0xfb22].raw >> 8) <= local_af8) &&
           (local_109d = false, local_af8 <= (int)(uint)(local_b38[0xfb22].raw & 0xff))) {
          local_109e = local_b38[0xfb24].raw >> 8 <= local_ac0 &&
                       local_ac0 <= (local_b38[0xfb24].raw & 0xff);
          local_109d = local_109e;
        }
        local_b04 = local_109d;
        local_aa8 = local_b38;
        local_aac = local_af8;
        local_ab0 = (uint)local_b38->raw;
        local_a88 = local_af8;
        local_a8c = local_ab0;
        local_a90 = (uint)(local_b38[0xfb23].raw >> 8);
        local_a94 = (uint)(local_b38[0xfb23].raw & 0xff);
        local_a98 = (uint)(local_b38[0xfb25].raw >> 8);
        local_a9c = (uint)(local_b38[0xfb25].raw & 0xff);
        local_109f = false;
        if (((int)(uint)(local_b38[0xfb23].raw >> 8) <= local_af8) &&
           (local_109f = false, local_af8 <= (int)(uint)(local_b38[0xfb23].raw & 0xff))) {
          local_10a0 = local_b38[0xfb25].raw >> 8 <= local_ab0 &&
                       local_ab0 <= (local_b38[0xfb25].raw & 0xff);
          local_109f = local_10a0;
        }
        local_b05 = local_109f;
        bVar8 = true;
        if (local_109d == false) {
          bVar8 = local_109f;
        }
        local_b06 = (bVar8 ^ 0xffU) & 1;
        local_b07 = (byte)(local_b38[0xfb0d].raw >> 0xd) & 1;
        local_b08 = (byte)(local_b38[0xfb0d].raw >> 0xe) & 1;
        local_b09 = -(char)(local_b38[0xfb0d].sraw >> 0xf);
        local_b0a = 1;
        if (local_b07 == 0) {
          local_b0a = local_b08;
        }
        if ((local_109d == false) || (local_b07 == 0)) {
          if ((local_109f == false) || (local_b08 == 0)) {
            if (((*(byte *)((long)local_b38 + (long)local_af8 + 0x26342) & 1) == 0) ||
               (local_b09 == '\0')) {
              if ((local_b06 != 0) && (local_b0a != 0)) {
                local_b03 = (byte)(*(ushort *)((long)local_b38 + 0x3ec9a) >> 5) & 1;
              }
            }
            else {
              local_b03 = (byte)(*(ushort *)((long)local_b38 + 0x3ec9a) >> 0xd) & 1;
            }
          }
          else {
            local_b03 = (byte)(local_b38[0xfb26].raw >> 0xd) & 1;
          }
        }
        else {
          local_b03 = (byte)(local_b38[0xfb26].raw >> 5) & 1;
        }
        for (local_b10 = 3; -1 < (int)local_b10; local_b10 = local_b10 - 1) {
          local_b14 = background_priorities[(int)local_b10];
          local_b15 = local_ae7[local_b14] & 1;
          local_b16 = true;
          if ((local_b38[0xfb28].raw >> 6 & 3) != 3) {
            local_b16 = (local_b38[0xfb28].raw >> 6 & 3) == 2;
          }
          local_b17 = local_af3[local_b00] & 1;
          local_b18 = 0;
          if ((local_b38[0xfb28].raw >> 6 & 3) == 1) {
            local_b18 = local_b17;
          }
          local_b19 = false;
          if (((local_b03 != 0) && (local_b19 = false, (local_aed[local_b14] & 1) != 0)) &&
             (local_b19 = true, local_b18 == 0)) {
            local_b19 = local_b16;
          }
          local_b1a = false;
          if (((*(byte *)((long)local_b38 + (long)local_af8 + 0x26252) & 1) != 0) &&
             (local_b1a = true, local_b17 == 0)) {
            local_b1a = local_b16;
          }
          local_b1b = local_b17;
          local_b1e = *(ushort *)
                       ((long)local_b38 + (long)local_af8 * 2 + (long)local_b14 * 0x1e0 + 0x25802);
          if ((short)local_b1e < 0) {
            local_b15 = 0;
          }
          if (((local_b15 == 0) || (local_b19 == false)) || ((short)local_b1e < 0)) {
            if (local_b15 != 0) {
              local_afa = local_b1e;
              local_b02 = local_b1e;
              local_b00 = local_b14;
            }
          }
          else {
            switch(local_b38[0xfb28].raw >> 6 & 3) {
            case 0:
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c"
                      ,0x229);
              fprintf(_stderr,"Determined we should blend even though blending was off?\n\x1b[0;m");
              exit(1);
            case 1:
              local_a5c = local_afa;
              local_a5e = local_b1e;
              local_a5f = local_ae2;
              local_a60 = local_ae1;
              local_a64 = (local_afa & 0x1f) * local_1098 + (local_b1e & 0x1f) * local_1094;
              local_a68 = (local_afa >> 5 & 0x1f) * local_1098 +
                          (local_b1e >> 5 & 0x1f) * local_1094;
              local_a6c = (local_afa >> 10 & 0x1f) * local_1098 +
                          (local_b1e >> 10 & 0x1f) * local_1094;
              local_928 = local_a64 >> 4;
              local_924 = 0x1f;
              if (local_928 < 0x20) {
                local_920 = local_928;
              }
              else {
                local_920 = 0x1f;
              }
              local_934 = local_a68 >> 4;
              local_930 = 0x1f;
              if (local_934 < 0x20) {
                local_92c = local_934;
              }
              else {
                local_92c = 0x1f;
              }
              local_940 = local_a6c >> 4;
              local_93c = 0x1f;
              if (local_940 < 0x20) {
                local_938 = local_940;
              }
              else {
                local_938 = 0x1f;
              }
              local_a5a = local_a5a & 0x8000 | (ushort)local_920 & 0x1f |
                          ((ushort)local_92c & 0x1f) << 5 | ((ushort)local_938 & 0x1f) << 10;
              local_b20 = local_a5a;
              local_b02 = local_a5a;
              break;
            case 2:
              local_a4c = 0x10 - local_ae3;
              local_a48 = white;
              local_a4a = local_b1e;
              local_a4b = local_ae3;
              local_a50 = (white.raw & 0x1f) * local_109c +
                          (uint)(local_b1e & 0x1f) * (uint)local_a4c;
              local_a54 = (white.raw >> 5 & 0x1f) * local_109c +
                          (uint)(local_b1e >> 5 & 0x1f) * (uint)local_a4c;
              local_a58 = (white.raw >> 10 & 0x1f) * local_109c +
                          (uint)(local_b1e >> 10 & 0x1f) * (uint)local_a4c;
              local_94c = local_a50 >> 4;
              local_948 = 0x1f;
              if (local_94c < 0x20) {
                local_944 = local_94c;
              }
              else {
                local_944 = 0x1f;
              }
              local_958 = local_a54 >> 4;
              local_954 = 0x1f;
              if (local_958 < 0x20) {
                local_950 = local_958;
              }
              else {
                local_950 = 0x1f;
              }
              local_964 = local_a58 >> 4;
              local_960 = 0x1f;
              if (local_964 < 0x20) {
                local_95c = local_964;
              }
              else {
                local_95c = 0x1f;
              }
              local_a46 = local_a46 & 0x8000 | (ushort)local_944 & 0x1f |
                          ((ushort)local_950 & 0x1f) << 5 | ((ushort)local_95c & 0x1f) << 10;
              local_b22 = local_a46;
              local_b02 = local_a46;
              break;
            case 3:
              local_a38 = 0x10 - local_ae3;
              local_a34 = black;
              local_a36 = local_b1e;
              local_a37 = local_ae3;
              local_a3c = (black.raw & 0x1f) * local_109c +
                          (uint)(local_b1e & 0x1f) * (uint)local_a38;
              local_a40 = (black.raw >> 5 & 0x1f) * local_109c +
                          (uint)(local_b1e >> 5 & 0x1f) * (uint)local_a38;
              local_a44 = (black.raw >> 10 & 0x1f) * local_109c +
                          (uint)(local_b1e >> 10 & 0x1f) * (uint)local_a38;
              local_970 = local_a3c >> 4;
              local_96c = 0x1f;
              if (local_970 < 0x20) {
                local_968 = local_970;
              }
              else {
                local_968 = 0x1f;
              }
              local_97c = local_a40 >> 4;
              local_978 = 0x1f;
              if (local_97c < 0x20) {
                local_974 = local_97c;
              }
              else {
                local_974 = 0x1f;
              }
              local_988 = local_a44 >> 4;
              local_984 = 0x1f;
              if (local_988 < 0x20) {
                local_980 = local_988;
              }
              else {
                local_980 = 0x1f;
              }
              local_a32 = local_a32 & 0x8000 | (ushort)local_968 & 0x1f |
                          ((ushort)local_974 & 0x1f) << 5 | ((ushort)local_980 & 0x1f) << 10;
              local_b24 = local_a32;
              local_b02 = local_a32;
            }
            local_b00 = local_b14;
            local_afa = local_b1e;
          }
          if ((*(byte *)((long)local_b38 + (long)local_af8 + 0x26162) == local_b10) &&
             (-1 < *(short *)((long)local_b38 + (long)local_af8 * 2 + 0x25f82))) {
            local_b1e = *(ushort *)((long)local_b38 + (long)local_af8 * 2 + 0x25f82);
            if (local_b1a == false) {
              local_b02 = local_b1e;
            }
            else {
              if (local_b17 == 0) {
                local_b25 = (byte)(local_b38[0xfb28].raw >> 6) & 3;
              }
              else {
                local_b25 = 1;
              }
              switch(local_b25) {
              case 0:
                fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                        "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c"
                        ,0x246);
                fprintf(_stderr,"Determined we should blend even though blending was off?\n\x1b[0;m"
                       );
                exit(1);
              case 1:
                local_a20 = local_afa;
                local_a22 = local_b1e;
                local_a23 = local_ae2;
                local_a24 = local_ae1;
                local_a28 = (local_afa & 0x1f) * local_1098 + (local_b1e & 0x1f) * local_1094;
                local_a2c = (local_afa >> 5 & 0x1f) * local_1098 +
                            (local_b1e >> 5 & 0x1f) * local_1094;
                local_a30 = (local_afa >> 10 & 0x1f) * local_1098 +
                            (local_b1e >> 10 & 0x1f) * local_1094;
                local_994 = local_a28 >> 4;
                local_990 = 0x1f;
                if (local_994 < 0x20) {
                  local_98c = local_994;
                }
                else {
                  local_98c = 0x1f;
                }
                local_9a0 = local_a2c >> 4;
                local_99c = 0x1f;
                if (local_9a0 < 0x20) {
                  local_998 = local_9a0;
                }
                else {
                  local_998 = 0x1f;
                }
                local_9ac = local_a30 >> 4;
                local_9a8 = 0x1f;
                if (local_9ac < 0x20) {
                  local_9a4 = local_9ac;
                }
                else {
                  local_9a4 = 0x1f;
                }
                local_a1e = local_a1e & 0x8000 | (ushort)local_98c & 0x1f |
                            ((ushort)local_998 & 0x1f) << 5 | ((ushort)local_9a4 & 0x1f) << 10;
                local_b28 = local_a1e;
                local_b02 = local_a1e;
                break;
              case 2:
                local_a10 = 0x10 - local_ae3;
                local_a0c = white;
                local_a0e = local_b1e;
                local_a0f = local_ae3;
                local_a14 = (white.raw & 0x1f) * local_109c +
                            (uint)(local_b1e & 0x1f) * (uint)local_a10;
                local_a18 = (white.raw >> 5 & 0x1f) * local_109c +
                            (uint)(local_b1e >> 5 & 0x1f) * (uint)local_a10;
                local_a1c = (white.raw >> 10 & 0x1f) * local_109c +
                            (uint)(local_b1e >> 10 & 0x1f) * (uint)local_a10;
                local_9b8 = local_a14 >> 4;
                local_9b4 = 0x1f;
                if (local_9b8 < 0x20) {
                  local_9b0 = local_9b8;
                }
                else {
                  local_9b0 = 0x1f;
                }
                local_9c4 = local_a18 >> 4;
                local_9c0 = 0x1f;
                if (local_9c4 < 0x20) {
                  local_9bc = local_9c4;
                }
                else {
                  local_9bc = 0x1f;
                }
                local_9d0 = local_a1c >> 4;
                local_9cc = 0x1f;
                if (local_9d0 < 0x20) {
                  local_9c8 = local_9d0;
                }
                else {
                  local_9c8 = 0x1f;
                }
                local_a0a = local_a0a & 0x8000 | (ushort)local_9b0 & 0x1f |
                            ((ushort)local_9bc & 0x1f) << 5 | ((ushort)local_9c8 & 0x1f) << 10;
                local_b2a = local_a0a;
                local_b02 = local_a0a;
                break;
              case 3:
                local_9fc = 0x10 - local_ae3;
                local_9f8 = black;
                local_9fa = local_b1e;
                local_9fb = local_ae3;
                local_a00 = (black.raw & 0x1f) * local_109c +
                            (uint)(local_b1e & 0x1f) * (uint)local_9fc;
                local_a04 = (black.raw >> 5 & 0x1f) * local_109c +
                            (uint)(local_b1e >> 5 & 0x1f) * (uint)local_9fc;
                local_a08 = (black.raw >> 10 & 0x1f) * local_109c +
                            (uint)(local_b1e >> 10 & 0x1f) * (uint)local_9fc;
                local_9dc = local_a00 >> 4;
                local_9d8 = 0x1f;
                if (local_9dc < 0x20) {
                  local_9d4 = local_9dc;
                }
                else {
                  local_9d4 = 0x1f;
                }
                local_9e8 = local_a04 >> 4;
                local_9e4 = 0x1f;
                if (local_9e8 < 0x20) {
                  local_9e0 = local_9e8;
                }
                else {
                  local_9e0 = 0x1f;
                }
                local_9f4 = local_a08 >> 4;
                local_9f0 = 0x1f;
                if (local_9f4 < 0x20) {
                  local_9ec = local_9f4;
                }
                else {
                  local_9ec = 0x1f;
                }
                local_9f6 = local_9f6 & 0x8000 | (ushort)local_9d4 & 0x1f |
                            ((ushort)local_9e0 & 0x1f) << 5 | ((ushort)local_9ec & 0x1f) << 10;
                local_b2c = local_9f6;
                local_b02 = local_9f6;
              }
            }
            local_afa = local_b1e;
            local_b00 = 4;
          }
        }
        *(undefined1 *)((long)local_b38 + (long)local_af8 * 4 + (ulong)local_b38->raw * 0x3c0 + 2) =
             0xff;
        *(byte *)((long)local_b38 + (long)local_af8 * 4 + (ulong)local_b38->raw * 0x3c0 + 3) =
             (byte)local_b02 << 3 | (byte)local_b02 & 7;
        *(byte *)(local_b38 + (ulong)local_b38->raw * 0xf0 + (long)local_af8 + 1) =
             (char)(local_b02 >> 5) << 3 | (byte)(local_b02 >> 5) & 7;
        bVar5 = (byte)(local_b02 >> 8);
        *(byte *)((long)local_b38 + (long)local_af8 * 4 + (ulong)local_b38->raw * 0x3c0 + 5) =
             (bVar5 >> 2) << 3 | bVar5 >> 2 & 7;
      }
      break;
    case (bg_rotation_scaling_t *)0x3:
      render_line_mode3(in_stack_ffffffffffffef30);
      break;
    case (bg_rotation_scaling_t *)0x4:
      render_line_mode4(in_stack_ffffffffffffef38);
      break;
    default:
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c",
              0x2fe);
      fprintf(_stderr,"Unknown graphics mode: %d\n\x1b[0;m",(ulong)(in_RDI[0xfb0d].raw & 7));
      exit(1);
    }
  }
  return;
}

Assistant:

void ppu_hblank(gba_ppu_t* ppu) {
    if (!is_vblank(ppu)) {
        dma_start_trigger(HBlank);
    }
    if (ppu->DISPSTAT.hblank_irq_enable) {
        request_interrupt(IRQ_HBLANK);
    }
    ppu->DISPSTAT.hblank = true;
    if (ppu->y < GBA_SCREEN_Y && !ppu->DISPCNT.forced_blank) { // i.e. not VBlank
        render_line(ppu);
    }
}